

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersector1<4>::
     intersect_n<embree::avx512::OrientedCurve1Intersector1<embree::BezierCurveT,7,8>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  ulong uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  uint uVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  bool bVar23;
  byte bVar24;
  uint uVar25;
  ulong uVar26;
  long lVar28;
  uint uVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  int iVar98;
  undefined4 uVar99;
  vint4 bi_2;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  vint4 bi_1;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  vint4 bi;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  vfloat4 a0;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  vfloat4 b0;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  vint4 ai;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  vint4 ai_1;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  float fVar160;
  float fVar169;
  vint4 ai_2;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar178;
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  vfloat4 a0_4;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  float fVar203;
  float fVar214;
  float fVar215;
  vfloat4 b0_1;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar216;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar217;
  float fVar218;
  float fVar219;
  __m128 a_3;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  vfloat4 a0_5;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 in_ZMM31 [64];
  undefined1 auVar253 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_31c;
  undefined1 local_318 [16];
  ulong local_300;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  long local_258;
  Primitive *local_250;
  RTCFilterFunctionNArguments local_248;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  uint auStack_198 [4];
  undefined8 local_188;
  float local_180;
  undefined8 local_17c;
  uint local_174;
  uint local_170;
  uint local_16c;
  uint local_168;
  undefined1 local_158 [16];
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined8 uStack_b8;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar27;
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar238 [32];
  
  uVar26 = (ulong)(byte)prim[1];
  auVar48 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 4 + 6)));
  auVar45 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 5 + 6)));
  auVar46 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 6 + 6)));
  lVar30 = uVar26 * 0x25;
  auVar47 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0xf + 6)));
  auVar49 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar50 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0x11 + 6)));
  auVar51 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0x1a + 6)));
  auVar52 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0x1b + 6)));
  auVar53 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0x1c + 6)));
  auVar84._16_16_ = in_YmmResult._16_16_;
  auVar38 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(prim + lVar30 + 0x12)));
  auVar39 = vsubps_avx512vl((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                            *(undefined1 (*) [16])(prim + lVar30 + 6));
  fVar219 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar30 + 0x16)) *
            *(float *)(prim + lVar30 + 0x1a);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar26 * 7 + 6);
  auVar59 = vpmovsxwd_avx(auVar56);
  auVar40 = vpbroadcastd_avx512vl();
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar26 * 0xb + 6);
  auVar41 = vpmovsxwd_avx512vl(auVar54);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + uVar26 * 9 + 6);
  auVar42 = vpmovsxwd_avx512vl(auVar58);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *(ulong *)(prim + uVar26 * 0xd + 6);
  auVar43 = vpmovsxwd_avx512vl(auVar61);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar26 * 0x12 + 6);
  auVar60 = vpmovsxwd_avx(auVar55);
  auVar62._8_8_ = 0;
  auVar62._0_8_ = *(ulong *)(prim + uVar26 * 0x16 + 6);
  auVar62 = vpmovsxwd_avx(auVar62);
  auVar63._8_8_ = 0;
  auVar63._0_8_ = *(ulong *)(prim + uVar26 * 0x14 + 6);
  auVar63 = vpmovsxwd_avx(auVar63);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *(ulong *)(prim + uVar26 * 0x18 + 6);
  auVar64 = vpmovsxwd_avx(auVar64);
  auVar39 = vmulps_avx512vl(auVar38,auVar39);
  auVar38 = vmulps_avx512vl(auVar38,(undefined1  [16])(ray->super_RayK<1>).dir.field_0);
  auVar44 = vcvtdq2ps_avx512vl(auVar48);
  auVar45 = vcvtdq2ps_avx512vl(auVar45);
  auVar46 = vcvtdq2ps_avx512vl(auVar46);
  auVar47 = vcvtdq2ps_avx512vl(auVar47);
  auVar56 = vcvtdq2ps_avx(auVar49);
  auVar54 = vcvtdq2ps_avx(auVar50);
  auVar58 = vcvtdq2ps_avx(auVar51);
  auVar61 = vcvtdq2ps_avx(auVar52);
  auVar55 = vcvtdq2ps_avx(auVar53);
  auVar48 = vbroadcastss_avx512vl(auVar38);
  auVar49 = vshufps_avx512vl(auVar38,auVar38,0x55);
  auVar50 = vshufps_avx512vl(auVar38,auVar38,0xaa);
  auVar51 = vmulps_avx512vl(auVar50,auVar46);
  auVar38._0_4_ = auVar50._0_4_ * auVar54._0_4_;
  auVar38._4_4_ = auVar50._4_4_ * auVar54._4_4_;
  auVar38._8_4_ = auVar50._8_4_ * auVar54._8_4_;
  auVar38._12_4_ = auVar50._12_4_ * auVar54._12_4_;
  auVar53._0_4_ = auVar55._0_4_ * auVar50._0_4_;
  auVar53._4_4_ = auVar55._4_4_ * auVar50._4_4_;
  auVar53._8_4_ = auVar55._8_4_ * auVar50._8_4_;
  auVar53._12_4_ = auVar55._12_4_ * auVar50._12_4_;
  auVar50 = vfmadd231ps_avx512vl(auVar51,auVar49,auVar45);
  auVar51 = vfmadd231ps_avx512vl(auVar38,auVar49,auVar56);
  auVar49 = vfmadd231ps_avx512vl(auVar53,auVar61,auVar49);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar48,auVar44);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar48,auVar47);
  auVar48 = vfmadd231ps_fma(auVar49,auVar58,auVar48);
  auVar49 = vbroadcastss_avx512vl(auVar39);
  auVar52 = vshufps_avx512vl(auVar39,auVar39,0x55);
  auVar246 = ZEXT1664(auVar52);
  auVar53 = vshufps_avx512vl(auVar39,auVar39,0xaa);
  auVar46 = vmulps_avx512vl(auVar53,auVar46);
  auVar54 = vmulps_avx512vl(auVar53,auVar54);
  auVar55 = vmulps_avx512vl(auVar53,auVar55);
  auVar45 = vfmadd231ps_avx512vl(auVar46,auVar52,auVar45);
  auVar56 = vfmadd231ps_avx512vl(auVar54,auVar52,auVar56);
  auVar54 = vfmadd231ps_avx512vl(auVar55,auVar52,auVar61);
  auVar53 = vfmadd231ps_avx512vl(auVar45,auVar49,auVar44);
  auVar248 = ZEXT1664(auVar53);
  auVar38 = vfmadd231ps_avx512vl(auVar56,auVar49,auVar47);
  auVar52 = vfmadd231ps_fma(auVar54,auVar49,auVar58);
  auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar250 = ZEXT1664(auVar56);
  auVar54 = vandps_avx512vl(auVar50,auVar56);
  auVar170._8_4_ = 0x219392ef;
  auVar170._0_8_ = 0x219392ef219392ef;
  auVar170._12_4_ = 0x219392ef;
  uVar33 = vcmpps_avx512vl(auVar54,auVar170,1);
  bVar36 = (bool)((byte)uVar33 & 1);
  auVar39._0_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar50._0_4_;
  bVar36 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar39._4_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar50._4_4_;
  bVar36 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar39._8_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar50._8_4_;
  bVar36 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar39._12_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar50._12_4_;
  auVar54 = vandps_avx512vl(auVar51,auVar56);
  uVar33 = vcmpps_avx512vl(auVar54,auVar170,1);
  bVar36 = (bool)((byte)uVar33 & 1);
  auVar44._0_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar51._0_4_;
  bVar36 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar44._4_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar51._4_4_;
  bVar36 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar44._8_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar51._8_4_;
  bVar36 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar44._12_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar51._12_4_;
  auVar56 = vandps_avx512vl(auVar48,auVar56);
  uVar33 = vcmpps_avx512vl(auVar56,auVar170,1);
  bVar36 = (bool)((byte)uVar33 & 1);
  auVar57._0_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar48._0_4_;
  bVar36 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar57._4_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar48._4_4_;
  bVar36 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar57._8_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar48._8_4_;
  bVar36 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar57._12_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar48._12_4_;
  auVar56 = vrcp14ps_avx512vl(auVar39);
  auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar251 = ZEXT1664(auVar54);
  auVar58 = vfnmadd213ps_avx512vl(auVar39,auVar56,auVar54);
  auVar61 = vfmadd132ps_fma(auVar58,auVar56,auVar56);
  auVar56 = vrcp14ps_avx512vl(auVar44);
  auVar58 = vfnmadd213ps_avx512vl(auVar44,auVar56,auVar54);
  auVar55 = vfmadd132ps_fma(auVar58,auVar56,auVar56);
  auVar56 = vrcp14ps_avx512vl(auVar57);
  auVar54 = vfnmadd213ps_avx512vl(auVar57,auVar56,auVar54);
  auVar49 = vfmadd132ps_fma(auVar54,auVar56,auVar56);
  auVar134._4_4_ = fVar219;
  auVar134._0_4_ = fVar219;
  auVar134._8_4_ = fVar219;
  auVar134._12_4_ = fVar219;
  auVar56 = vcvtdq2ps_avx(auVar59);
  auVar54 = vcvtdq2ps_avx512vl(auVar41);
  auVar54 = vsubps_avx(auVar54,auVar56);
  auVar50 = vfmadd213ps_fma(auVar54,auVar134,auVar56);
  auVar54 = vcvtdq2ps_avx512vl(auVar42);
  auVar56 = vcvtdq2ps_avx512vl(auVar43);
  auVar56 = vsubps_avx(auVar56,auVar54);
  auVar51 = vfmadd213ps_fma(auVar56,auVar134,auVar54);
  auVar56 = vcvtdq2ps_avx(auVar60);
  auVar54 = vcvtdq2ps_avx(auVar62);
  auVar54 = vsubps_avx(auVar54,auVar56);
  auVar62 = vfmadd213ps_fma(auVar54,auVar134,auVar56);
  auVar56 = vcvtdq2ps_avx(auVar63);
  auVar54 = vcvtdq2ps_avx(auVar64);
  auVar58 = vsubps_avx(auVar54,auVar56);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar26 * 0x1d + 6);
  auVar54 = vpmovsxwd_avx(auVar48);
  auVar58 = vfmadd213ps_fma(auVar58,auVar134,auVar56);
  auVar56 = vcvtdq2ps_avx(auVar54);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar26 * 0x21 + 6);
  auVar54 = vpmovsxwd_avx(auVar45);
  auVar54 = vcvtdq2ps_avx(auVar54);
  auVar54 = vsubps_avx(auVar54,auVar56);
  auVar63 = vfmadd213ps_fma(auVar54,auVar134,auVar56);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar26 * 0x1f + 6);
  auVar56 = vpmovsxwd_avx(auVar46);
  auVar56 = vcvtdq2ps_avx(auVar56);
  local_250 = prim;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar26 * 0x23 + 6);
  auVar54 = vpmovsxwd_avx(auVar47);
  auVar54 = vcvtdq2ps_avx(auVar54);
  auVar54 = vsubps_avx(auVar54,auVar56);
  auVar54 = vfmadd213ps_fma(auVar54,auVar134,auVar56);
  auVar56 = vsubps_avx512vl(auVar50,auVar53);
  auVar42._0_4_ = auVar61._0_4_ * auVar56._0_4_;
  auVar42._4_4_ = auVar61._4_4_ * auVar56._4_4_;
  auVar42._8_4_ = auVar61._8_4_ * auVar56._8_4_;
  auVar42._12_4_ = auVar61._12_4_ * auVar56._12_4_;
  auVar56 = vsubps_avx512vl(auVar51,auVar53);
  auVar41._0_4_ = auVar61._0_4_ * auVar56._0_4_;
  auVar41._4_4_ = auVar61._4_4_ * auVar56._4_4_;
  auVar41._8_4_ = auVar61._8_4_ * auVar56._8_4_;
  auVar41._12_4_ = auVar61._12_4_ * auVar56._12_4_;
  auVar56 = vsubps_avx512vl(auVar62,auVar38);
  auVar43._0_4_ = auVar55._0_4_ * auVar56._0_4_;
  auVar43._4_4_ = auVar55._4_4_ * auVar56._4_4_;
  auVar43._8_4_ = auVar55._8_4_ * auVar56._8_4_;
  auVar43._12_4_ = auVar55._12_4_ * auVar56._12_4_;
  auVar56 = vsubps_avx512vl(auVar58,auVar38);
  auVar60._0_4_ = auVar55._0_4_ * auVar56._0_4_;
  auVar60._4_4_ = auVar55._4_4_ * auVar56._4_4_;
  auVar60._8_4_ = auVar55._8_4_ * auVar56._8_4_;
  auVar60._12_4_ = auVar55._12_4_ * auVar56._12_4_;
  auVar56 = vsubps_avx(auVar63,auVar52);
  auVar161._0_4_ = auVar49._0_4_ * auVar56._0_4_;
  auVar161._4_4_ = auVar49._4_4_ * auVar56._4_4_;
  auVar161._8_4_ = auVar49._8_4_ * auVar56._8_4_;
  auVar161._12_4_ = auVar49._12_4_ * auVar56._12_4_;
  auVar56 = vsubps_avx(auVar54,auVar52);
  auVar59._0_4_ = auVar49._0_4_ * auVar56._0_4_;
  auVar59._4_4_ = auVar49._4_4_ * auVar56._4_4_;
  auVar59._8_4_ = auVar49._8_4_ * auVar56._8_4_;
  auVar59._12_4_ = auVar49._12_4_ * auVar56._12_4_;
  auVar56 = vpminsd_avx(auVar42,auVar41);
  auVar54 = vpminsd_avx(auVar43,auVar60);
  auVar56 = vmaxps_avx(auVar56,auVar54);
  auVar54 = vpminsd_avx(auVar161,auVar59);
  uVar99 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar49._4_4_ = uVar99;
  auVar49._0_4_ = uVar99;
  auVar49._8_4_ = uVar99;
  auVar49._12_4_ = uVar99;
  auVar54 = vmaxps_avx512vl(auVar54,auVar49);
  auVar56 = vmaxps_avx(auVar56,auVar54);
  auVar50._8_4_ = 0x3f7ffffa;
  auVar50._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar50._12_4_ = 0x3f7ffffa;
  local_158 = vmulps_avx512vl(auVar56,auVar50);
  auVar56 = vpmaxsd_avx(auVar42,auVar41);
  auVar54 = vpmaxsd_avx(auVar43,auVar60);
  auVar56 = vminps_avx(auVar56,auVar54);
  auVar54 = vpmaxsd_avx(auVar161,auVar59);
  fVar219 = (ray->super_RayK<1>).tfar;
  auVar51._4_4_ = fVar219;
  auVar51._0_4_ = fVar219;
  auVar51._8_4_ = fVar219;
  auVar51._12_4_ = fVar219;
  auVar54 = vminps_avx512vl(auVar54,auVar51);
  auVar56 = vminps_avx(auVar56,auVar54);
  auVar52._8_4_ = 0x3f800003;
  auVar52._0_8_ = 0x3f8000033f800003;
  auVar52._12_4_ = 0x3f800003;
  auVar56 = vmulps_avx512vl(auVar56,auVar52);
  uVar14 = vcmpps_avx512vl(local_158,auVar56,2);
  uVar15 = vpcmpgtd_avx512vl(auVar40,_DAT_01f4ad30);
  uVar33 = (ulong)((byte)uVar14 & 0xf & (byte)uVar15);
  auVar56 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar253 = ZEXT1664(auVar56);
  auVar84._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar249 = ZEXT1664(auVar84._0_16_);
LAB_018b7c96:
  if (uVar33 == 0) {
    return;
  }
  lVar30 = 0;
  for (uVar26 = uVar33; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
    lVar30 = lVar30 + 1;
  }
  uVar6 = *(uint *)(local_250 + 2);
  pGVar8 = (context->scene->geometries).items[uVar6].ptr;
  fVar219 = (pGVar8->time_range).lower;
  fVar219 = pGVar8->fnumTimeSegments *
            (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar219) /
            ((pGVar8->time_range).upper - fVar219));
  auVar56 = vroundss_avx(ZEXT416((uint)fVar219),ZEXT416((uint)fVar219),9);
  auVar80._16_16_ = auVar84._16_16_;
  auVar54 = vaddss_avx512f(ZEXT416((uint)pGVar8->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar56 = vminss_avx(auVar56,auVar54);
  auVar52 = vmaxss_avx512f(auVar253._0_16_,auVar56);
  local_300 = (ulong)*(uint *)(local_250 + lVar30 * 4 + 6);
  uVar26 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)*(uint *)(local_250 + lVar30 * 4 + 6) *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar31 = (long)(int)auVar52._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar31);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar31);
  auVar56 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar26);
  lVar30 = uVar26 + 1;
  auVar54 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar30);
  lVar28 = uVar26 + 2;
  auVar58 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar28);
  lVar1 = uVar26 + 3;
  auVar61 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar31);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar31);
  auVar55 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar26);
  auVar62 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar30);
  auVar63 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar28);
  auVar64 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  lVar11 = *(long *)(_Var9 + 0x38 + lVar31);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar31);
  auVar48 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar26);
  auVar45 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar30);
  auVar46 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar28);
  auVar47 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  lVar11 = *(long *)(lVar10 + 0x38 + lVar31);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar31);
  auVar49 = *(undefined1 (*) [16])(lVar11 + uVar26 * lVar10);
  auVar50 = *(undefined1 (*) [16])(lVar11 + lVar30 * lVar10);
  auVar51 = *(undefined1 (*) [16])(lVar11 + lVar28 * lVar10);
  fVar219 = fVar219 - auVar52._0_4_;
  auVar80._0_16_ = vxorps_avx512vl(auVar248._0_16_,auVar248._0_16_);
  auVar52 = vmulps_avx512vl(auVar61,auVar80._0_16_);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar58,auVar80._0_16_);
  auVar53 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar54,auVar52);
  auVar53 = vaddps_avx512vl(auVar56,auVar53);
  auVar42 = auVar249._0_16_;
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar54,auVar42);
  auVar52 = vfnmadd231ps_avx512vl(auVar52,auVar56,auVar42);
  auVar59 = vmulps_avx512vl(auVar64,auVar80._0_16_);
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar63,auVar80._0_16_);
  auVar60 = vxorps_avx512vl(auVar246._0_16_,auVar246._0_16_);
  auVar60 = vfmadd213ps_avx512vl(auVar60,auVar62,auVar59);
  auVar38 = vaddps_avx512vl(auVar55,auVar60);
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar62,auVar42);
  auVar59 = vfnmadd231ps_avx512vl(auVar59,auVar55,auVar42);
  auVar60 = vxorps_avx512vl(auVar60,auVar60);
  auVar60 = vfmadd213ps_avx512vl(auVar60,auVar58,auVar61);
  auVar60 = vfmadd231ps_avx512vl(auVar60,auVar54,auVar80._0_16_);
  auVar60 = vfmadd231ps_avx512vl(auVar60,auVar56,auVar80._0_16_);
  auVar61 = vmulps_avx512vl(auVar61,auVar42);
  auVar58 = vfnmadd231ps_avx512vl(auVar61,auVar42,auVar58);
  auVar54 = vfmadd231ps_avx512vl(auVar58,auVar80._0_16_,auVar54);
  auVar39 = vfnmadd231ps_avx512vl(auVar54,auVar80._0_16_,auVar56);
  auVar56 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar63,auVar64);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar62,auVar80._0_16_);
  auVar40 = vfmadd231ps_avx512vl(auVar56,auVar55,auVar80._0_16_);
  auVar56 = vmulps_avx512vl(auVar64,auVar42);
  auVar56 = vfnmadd231ps_avx512vl(auVar56,auVar42,auVar63);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar80._0_16_,auVar62);
  auVar62 = vfnmadd231ps_avx512vl(auVar56,auVar80._0_16_,auVar55);
  auVar54 = vshufps_avx512vl(auVar52,auVar52,0xc9);
  auVar56 = vshufps_avx512vl(auVar38,auVar38,0xc9);
  auVar56 = vmulps_avx512vl(auVar52,auVar56);
  auVar56 = vfmsub231ps_avx512vl(auVar56,auVar54,auVar38);
  auVar58 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar56 = vshufps_avx(auVar59,auVar59,0xc9);
  auVar56 = vmulps_avx512vl(auVar52,auVar56);
  auVar56 = vfmsub231ps_fma(auVar56,auVar54,auVar59);
  auVar61 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar56 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar54 = vshufps_avx(auVar40,auVar40,0xc9);
  fVar217 = auVar39._0_4_;
  auVar149._0_4_ = fVar217 * auVar54._0_4_;
  fVar218 = auVar39._4_4_;
  auVar149._4_4_ = fVar218 * auVar54._4_4_;
  fVar160 = auVar39._8_4_;
  auVar149._8_4_ = fVar160 * auVar54._8_4_;
  fVar169 = auVar39._12_4_;
  auVar149._12_4_ = fVar169 * auVar54._12_4_;
  auVar54 = vfmsub231ps_fma(auVar149,auVar56,auVar40);
  auVar55 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar54 = vshufps_avx(auVar62,auVar62,0xc9);
  auVar150._0_4_ = fVar217 * auVar54._0_4_;
  auVar150._4_4_ = fVar218 * auVar54._4_4_;
  auVar150._8_4_ = fVar160 * auVar54._8_4_;
  auVar150._12_4_ = fVar169 * auVar54._12_4_;
  auVar54 = vfmsub231ps_fma(auVar150,auVar56,auVar62);
  auVar56 = vdpps_avx(auVar58,auVar58,0x7f);
  auVar62 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar65._4_28_ = auVar80._4_28_;
  auVar65._0_4_ = auVar56._0_4_;
  auVar54 = vrsqrt14ss_avx512f(auVar80._0_16_,auVar65._0_16_);
  auVar63 = vmulss_avx512f(auVar54,ZEXT416(0x3fc00000));
  auVar64 = vmulss_avx512f(auVar56,ZEXT416(0x3f000000));
  auVar64 = vmulss_avx512f(auVar64,auVar54);
  auVar64 = vmulss_avx512f(auVar64,ZEXT416((uint)(auVar54._0_4_ * auVar54._0_4_)));
  auVar54 = vdpps_avx(auVar58,auVar61,0x7f);
  fVar215 = auVar63._0_4_ - auVar64._0_4_;
  fVar178 = fVar215 * auVar58._0_4_;
  fVar192 = fVar215 * auVar58._4_4_;
  fVar193 = fVar215 * auVar58._8_4_;
  fVar194 = fVar215 * auVar58._12_4_;
  auVar63 = vbroadcastss_avx512vl(auVar56);
  auVar61 = vmulps_avx512vl(auVar63,auVar61);
  fVar203 = auVar54._0_4_;
  auVar100._0_4_ = fVar203 * auVar58._0_4_;
  auVar100._4_4_ = fVar203 * auVar58._4_4_;
  auVar100._8_4_ = fVar203 * auVar58._8_4_;
  auVar100._12_4_ = fVar203 * auVar58._12_4_;
  auVar58 = vsubps_avx(auVar61,auVar100);
  auVar54 = vrcp14ss_avx512f(auVar80._0_16_,auVar65._0_16_);
  auVar56 = vfnmadd213ss_avx512f(auVar56,auVar54,ZEXT416(0x40000000));
  fVar203 = auVar54._0_4_ * auVar56._0_4_;
  auVar56 = vdpps_avx(auVar55,auVar55,0x7f);
  auVar83._16_16_ = auVar80._16_16_;
  auVar83._0_16_ = auVar80._0_16_;
  auVar66._4_28_ = auVar83._4_28_;
  auVar66._0_4_ = auVar56._0_4_;
  auVar54 = vrsqrt14ss_avx512f(auVar80._0_16_,auVar66._0_16_);
  auVar61 = vmulss_avx512f(auVar54,ZEXT416(0x3fc00000));
  auVar63 = vmulss_avx512f(auVar56,ZEXT416(0x3f000000));
  fVar214 = auVar54._0_4_;
  fVar216 = auVar61._0_4_ - auVar63._0_4_ * fVar214 * fVar214 * fVar214;
  auVar54 = vdpps_avx(auVar55,auVar62,0x7f);
  auVar171._0_4_ = auVar55._0_4_ * fVar216;
  auVar171._4_4_ = auVar55._4_4_ * fVar216;
  auVar171._8_4_ = auVar55._8_4_ * fVar216;
  auVar171._12_4_ = auVar55._12_4_ * fVar216;
  auVar61 = vbroadcastss_avx512vl(auVar56);
  auVar61 = vmulps_avx512vl(auVar61,auVar62);
  fVar214 = auVar54._0_4_;
  auVar112._0_4_ = auVar55._0_4_ * fVar214;
  auVar112._4_4_ = auVar55._4_4_ * fVar214;
  auVar112._8_4_ = auVar55._8_4_ * fVar214;
  auVar112._12_4_ = auVar55._12_4_ * fVar214;
  auVar54 = vsubps_avx(auVar61,auVar112);
  auVar61 = vrcp14ss_avx512f(auVar80._0_16_,auVar66._0_16_);
  auVar56 = vfnmadd213ss_avx512f(auVar56,auVar61,ZEXT416(0x40000000));
  fVar214 = auVar61._0_4_ * auVar56._0_4_;
  auVar56 = vshufps_avx512vl(auVar53,auVar53,0xff);
  auVar129._0_4_ = fVar178 * auVar56._0_4_;
  auVar129._4_4_ = fVar192 * auVar56._4_4_;
  auVar129._8_4_ = fVar193 * auVar56._8_4_;
  auVar129._12_4_ = fVar194 * auVar56._12_4_;
  auVar59 = vsubps_avx512vl(auVar53,auVar129);
  auVar61 = vshufps_avx512vl(auVar52,auVar52,0xff);
  auVar101._0_4_ = fVar178 * auVar61._0_4_ + auVar56._0_4_ * fVar215 * fVar203 * auVar58._0_4_;
  auVar101._4_4_ = fVar192 * auVar61._4_4_ + auVar56._4_4_ * fVar215 * fVar203 * auVar58._4_4_;
  auVar101._8_4_ = fVar193 * auVar61._8_4_ + auVar56._8_4_ * fVar215 * fVar203 * auVar58._8_4_;
  auVar101._12_4_ = fVar194 * auVar61._12_4_ + auVar56._12_4_ * fVar215 * fVar203 * auVar58._12_4_;
  auVar58 = vsubps_avx512vl(auVar52,auVar101);
  auVar38 = vaddps_avx512vl(auVar53,auVar129);
  auVar61 = vaddps_avx512vl(auVar52,auVar101);
  auVar56 = vshufps_avx512vl(auVar60,auVar60,0xff);
  auVar179._0_4_ = auVar171._0_4_ * auVar56._0_4_;
  auVar179._4_4_ = auVar171._4_4_ * auVar56._4_4_;
  auVar179._8_4_ = auVar171._8_4_ * auVar56._8_4_;
  auVar179._12_4_ = auVar171._12_4_ * auVar56._12_4_;
  auVar52 = vsubps_avx512vl(auVar60,auVar179);
  auVar55 = vshufps_avx512vl(auVar39,auVar39,0xff);
  auVar55 = vmulps_avx512vl(auVar55,auVar171);
  auVar151._0_4_ = auVar55._0_4_ + auVar56._0_4_ * fVar216 * auVar54._0_4_ * fVar214;
  auVar151._4_4_ = auVar55._4_4_ + auVar56._4_4_ * fVar216 * auVar54._4_4_ * fVar214;
  auVar151._8_4_ = auVar55._8_4_ + auVar56._8_4_ * fVar216 * auVar54._8_4_ * fVar214;
  auVar151._12_4_ = auVar55._12_4_ + auVar56._12_4_ * fVar216 * auVar54._12_4_ * fVar214;
  auVar56 = vsubps_avx(auVar39,auVar151);
  auVar60 = vaddps_avx512vl(auVar60,auVar179);
  auVar162._0_4_ = auVar59._0_4_ + auVar58._0_4_ * 0.33333334;
  auVar162._4_4_ = auVar59._4_4_ + auVar58._4_4_ * 0.33333334;
  auVar162._8_4_ = auVar59._8_4_ + auVar58._8_4_ * 0.33333334;
  auVar162._12_4_ = auVar59._12_4_ + auVar58._12_4_ * 0.33333334;
  auVar135._0_4_ = auVar56._0_4_ * 0.33333334;
  auVar135._4_4_ = auVar56._4_4_ * 0.33333334;
  auVar135._8_4_ = auVar56._8_4_ * 0.33333334;
  auVar135._12_4_ = auVar56._12_4_ * 0.33333334;
  auVar63 = vsubps_avx(auVar52,auVar135);
  auVar102._0_4_ = auVar61._0_4_ * 0.33333334;
  auVar102._4_4_ = auVar61._4_4_ * 0.33333334;
  auVar102._8_4_ = auVar61._8_4_ * 0.33333334;
  auVar102._12_4_ = auVar61._12_4_ * 0.33333334;
  auVar39 = vaddps_avx512vl(auVar38,auVar102);
  auVar103._0_4_ = (fVar217 + auVar151._0_4_) * 0.33333334;
  auVar103._4_4_ = (fVar218 + auVar151._4_4_) * 0.33333334;
  auVar103._8_4_ = (fVar160 + auVar151._8_4_) * 0.33333334;
  auVar103._12_4_ = (fVar169 + auVar151._12_4_) * 0.33333334;
  auVar56 = *(undefined1 (*) [16])(lVar11 + lVar10 * lVar1);
  auVar64 = vsubps_avx(auVar60,auVar103);
  auVar54 = vmulps_avx512vl(auVar47,auVar80._0_16_);
  auVar58 = vfmadd231ps_avx512vl(auVar54,auVar46,auVar80._0_16_);
  auVar54 = vfmadd213ps_fma(ZEXT416(0) << 0x20,auVar45,auVar58);
  auVar40 = vaddps_avx512vl(auVar48,auVar54);
  auVar54 = vfmadd231ps_avx512vl(auVar58,auVar45,auVar42);
  auVar41 = vfnmadd231ps_avx512vl(auVar54,auVar48,auVar42);
  auVar54 = vmulps_avx512vl(auVar56,auVar80._0_16_);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar51,auVar80._0_16_);
  auVar58 = vxorps_avx512vl(auVar53,auVar53);
  auVar58 = vfmadd213ps_avx512vl(auVar58,auVar50,auVar54);
  auVar61 = vaddps_avx512vl(auVar49,auVar58);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar50,auVar42);
  auVar55 = vfnmadd231ps_avx512vl(auVar54,auVar49,auVar42);
  auVar54 = vxorps_avx512vl(auVar58,auVar58);
  auVar54 = vfmadd213ps_avx512vl(auVar54,auVar46,auVar47);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar45,auVar80._0_16_);
  auVar53 = vfmadd231ps_avx512vl(auVar54,auVar48,auVar80._0_16_);
  auVar54 = vmulps_avx512vl(auVar47,auVar42);
  auVar54 = vfnmadd231ps_avx512vl(auVar54,auVar42,auVar46);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar80._0_16_,auVar45);
  auVar48 = vfnmadd231ps_avx512vl(auVar54,auVar80._0_16_,auVar48);
  auVar54 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar51,auVar56);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar50,auVar80._0_16_);
  auVar62 = vfmadd231ps_avx512vl(auVar54,auVar49,auVar80._0_16_);
  auVar56 = vmulps_avx512vl(auVar56,auVar42);
  auVar56 = vfnmadd231ps_avx512vl(auVar56,auVar42,auVar51);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar80._0_16_,auVar50);
  auVar45 = vfnmadd231ps_avx512vl(auVar56,auVar80._0_16_,auVar49);
  auVar56 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar54 = vshufps_avx512vl(auVar61,auVar61,0xc9);
  fVar216 = auVar41._0_4_;
  auVar220._0_4_ = fVar216 * auVar54._0_4_;
  fVar217 = auVar41._4_4_;
  auVar220._4_4_ = fVar217 * auVar54._4_4_;
  fVar218 = auVar41._8_4_;
  auVar220._8_4_ = fVar218 * auVar54._8_4_;
  fVar160 = auVar41._12_4_;
  auVar220._12_4_ = fVar160 * auVar54._12_4_;
  auVar54 = vfmsub231ps_avx512vl(auVar220,auVar56,auVar61);
  auVar58 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar54 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar227._0_4_ = fVar216 * auVar54._0_4_;
  auVar227._4_4_ = fVar217 * auVar54._4_4_;
  auVar227._8_4_ = fVar218 * auVar54._8_4_;
  auVar227._12_4_ = fVar160 * auVar54._12_4_;
  auVar56 = vfmsub231ps_fma(auVar227,auVar56,auVar55);
  auVar61 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar54 = vshufps_avx512vl(auVar48,auVar48,0xc9);
  auVar56 = vshufps_avx(auVar62,auVar62,0xc9);
  auVar56 = vmulps_avx512vl(auVar48,auVar56);
  auVar56 = vfmsub231ps_fma(auVar56,auVar54,auVar62);
  auVar55 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar56 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar56 = vmulps_avx512vl(auVar48,auVar56);
  auVar56 = vfmsub231ps_fma(auVar56,auVar54,auVar45);
  auVar62 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar56 = vdpps_avx(auVar58,auVar58,0x7f);
  auVar67._16_16_ = auVar80._16_16_;
  auVar67._0_16_ = auVar80._0_16_;
  auVar68._4_28_ = auVar67._4_28_;
  auVar68._0_4_ = auVar56._0_4_;
  auVar54 = vrsqrt14ss_avx512f(auVar80._0_16_,auVar68._0_16_);
  auVar45 = vmulss_avx512f(auVar54,ZEXT416(0x3fc00000));
  auVar46 = vmulss_avx512f(auVar56,ZEXT416(0x3f000000));
  auVar46 = vmulss_avx512f(auVar46,auVar54);
  auVar54 = vmulss_avx512f(auVar46,ZEXT416((uint)(auVar54._0_4_ * auVar54._0_4_)));
  auVar54 = vsubss_avx512f(auVar45,auVar54);
  auVar239._0_4_ = auVar54._0_4_;
  auVar239._4_4_ = auVar239._0_4_;
  auVar239._8_4_ = auVar239._0_4_;
  auVar239._12_4_ = auVar239._0_4_;
  auVar54 = vdpps_avx(auVar58,auVar61,0x7f);
  auVar45 = vmulps_avx512vl(auVar58,auVar239);
  auVar46 = vbroadcastss_avx512vl(auVar56);
  auVar61 = vmulps_avx512vl(auVar46,auVar61);
  fVar203 = auVar54._0_4_;
  auVar136._0_4_ = auVar58._0_4_ * fVar203;
  auVar136._4_4_ = auVar58._4_4_ * fVar203;
  auVar136._8_4_ = auVar58._8_4_ * fVar203;
  auVar136._12_4_ = auVar58._12_4_ * fVar203;
  auVar58 = vsubps_avx(auVar61,auVar136);
  auVar54 = vrcp14ss_avx512f(auVar80._0_16_,auVar68._0_16_);
  auVar56 = vfnmadd213ss_avx512f(auVar56,auVar54,ZEXT416(0x40000000));
  fVar203 = auVar56._0_4_ * auVar54._0_4_;
  auVar56 = vdpps_avx(auVar55,auVar55,0x7f);
  auVar69._16_16_ = auVar80._16_16_;
  auVar69._0_16_ = auVar80._0_16_;
  auVar70._4_28_ = auVar69._4_28_;
  auVar70._0_4_ = auVar56._0_4_;
  auVar54 = vrsqrt14ss_avx512f(auVar80._0_16_,auVar70._0_16_);
  auVar61 = vmulss_avx512f(auVar54,ZEXT416(0x3fc00000));
  auVar46 = vmulss_avx512f(auVar56,ZEXT416(0x3f000000));
  fVar214 = auVar54._0_4_;
  fVar215 = auVar61._0_4_ - auVar46._0_4_ * fVar214 * fVar214 * fVar214;
  auVar233._0_4_ = auVar55._0_4_ * fVar215;
  auVar233._4_4_ = auVar55._4_4_ * fVar215;
  auVar233._8_4_ = auVar55._8_4_ * fVar215;
  auVar233._12_4_ = auVar55._12_4_ * fVar215;
  auVar54 = vdpps_avx(auVar55,auVar62,0x7f);
  auVar61 = vbroadcastss_avx512vl(auVar56);
  auVar61 = vmulps_avx512vl(auVar61,auVar62);
  fVar214 = auVar54._0_4_;
  auVar195._0_4_ = auVar55._0_4_ * fVar214;
  auVar195._4_4_ = auVar55._4_4_ * fVar214;
  auVar195._8_4_ = auVar55._8_4_ * fVar214;
  auVar195._12_4_ = auVar55._12_4_ * fVar214;
  auVar54 = vsubps_avx(auVar61,auVar195);
  auVar61 = vrcp14ss_avx512f(auVar80._0_16_,auVar70._0_16_);
  auVar56 = vfnmadd213ss_avx512f(auVar56,auVar61,ZEXT416(0x40000000));
  auVar252 = ZEXT464(0x3f800000);
  fVar214 = auVar61._0_4_ * auVar56._0_4_;
  auVar61 = vshufps_avx512vl(auVar40,auVar40,0xff);
  auVar55 = vmulps_avx512vl(auVar61,auVar45);
  auVar62 = vsubps_avx512vl(auVar40,auVar55);
  auVar56 = vshufps_avx(auVar41,auVar41,0xff);
  auVar56 = vmulps_avx512vl(auVar56,auVar45);
  auVar104._0_4_ = auVar56._0_4_ + auVar61._0_4_ * auVar239._0_4_ * fVar203 * auVar58._0_4_;
  auVar104._4_4_ = auVar56._4_4_ + auVar61._4_4_ * auVar239._0_4_ * fVar203 * auVar58._4_4_;
  auVar104._8_4_ = auVar56._8_4_ + auVar61._8_4_ * auVar239._0_4_ * fVar203 * auVar58._8_4_;
  auVar104._12_4_ = auVar56._12_4_ + auVar61._12_4_ * auVar239._0_4_ * fVar203 * auVar58._12_4_;
  auVar56 = vsubps_avx(auVar41,auVar104);
  auVar58 = vaddps_avx512vl(auVar40,auVar55);
  auVar61 = vshufps_avx512vl(auVar53,auVar53,0xff);
  auVar228._0_4_ = auVar61._0_4_ * auVar233._0_4_;
  auVar228._4_4_ = auVar61._4_4_ * auVar233._4_4_;
  auVar228._8_4_ = auVar61._8_4_ * auVar233._8_4_;
  auVar228._12_4_ = auVar61._12_4_ * auVar233._12_4_;
  auVar55 = vsubps_avx512vl(auVar53,auVar228);
  auVar45 = vshufps_avx512vl(auVar48,auVar48,0xff);
  auVar45 = vmulps_avx512vl(auVar45,auVar233);
  auVar137._0_4_ = auVar45._0_4_ + auVar61._0_4_ * fVar215 * auVar54._0_4_ * fVar214;
  auVar137._4_4_ = auVar45._4_4_ + auVar61._4_4_ * fVar215 * auVar54._4_4_ * fVar214;
  auVar137._8_4_ = auVar45._8_4_ + auVar61._8_4_ * fVar215 * auVar54._8_4_ * fVar214;
  auVar137._12_4_ = auVar45._12_4_ + auVar61._12_4_ * fVar215 * auVar54._12_4_ * fVar214;
  auVar54 = vsubps_avx512vl(auVar48,auVar137);
  auVar61 = vaddps_avx512vl(auVar53,auVar228);
  auVar48 = vaddps_avx512vl(auVar48,auVar137);
  auVar196._0_4_ = auVar62._0_4_ + auVar56._0_4_ * 0.33333334;
  auVar196._4_4_ = auVar62._4_4_ + auVar56._4_4_ * 0.33333334;
  auVar196._8_4_ = auVar62._8_4_ + auVar56._8_4_ * 0.33333334;
  auVar196._12_4_ = auVar62._12_4_ + auVar56._12_4_ * 0.33333334;
  auVar180._0_4_ = auVar54._0_4_ * 0.33333334;
  auVar180._4_4_ = auVar54._4_4_ * 0.33333334;
  auVar180._8_4_ = auVar54._8_4_ * 0.33333334;
  auVar180._12_4_ = auVar54._12_4_ * 0.33333334;
  auVar56 = vsubps_avx(auVar55,auVar180);
  auVar105._0_4_ = auVar58._0_4_ + (fVar216 + auVar104._0_4_) * 0.33333334;
  auVar105._4_4_ = auVar58._4_4_ + (fVar217 + auVar104._4_4_) * 0.33333334;
  auVar105._8_4_ = auVar58._8_4_ + (fVar218 + auVar104._8_4_) * 0.33333334;
  auVar105._12_4_ = auVar58._12_4_ + (fVar160 + auVar104._12_4_) * 0.33333334;
  auVar138._0_4_ = auVar48._0_4_ * 0.33333334;
  auVar138._4_4_ = auVar48._4_4_ * 0.33333334;
  auVar138._8_4_ = auVar48._8_4_ * 0.33333334;
  auVar138._12_4_ = auVar48._12_4_ * 0.33333334;
  auVar54 = vsubps_avx(auVar61,auVar138);
  auVar234._4_4_ = fVar219;
  auVar234._0_4_ = fVar219;
  auVar234._8_4_ = fVar219;
  auVar234._12_4_ = fVar219;
  auVar48 = vsubss_avx512f(ZEXT416(0x3f800000),ZEXT416((uint)fVar219));
  auVar48 = vbroadcastss_avx512vl(auVar48);
  auVar62 = vmulps_avx512vl(auVar234,auVar62);
  auVar45 = vmulps_avx512vl(auVar234,auVar196);
  auVar56 = vmulps_avx512vl(auVar234,auVar56);
  auVar240._0_4_ = fVar219 * auVar55._0_4_;
  auVar240._4_4_ = fVar219 * auVar55._4_4_;
  auVar240._8_4_ = fVar219 * auVar55._8_4_;
  auVar240._12_4_ = fVar219 * auVar55._12_4_;
  local_1a8 = vfmadd231ps_avx512vl(auVar62,auVar48,auVar59);
  local_1b8 = vfmadd231ps_avx512vl(auVar45,auVar48,auVar162);
  local_1c8 = vfmadd231ps_avx512vl(auVar56,auVar48,auVar63);
  local_1d8 = vfmadd231ps_avx512vl(auVar240,auVar48,auVar52);
  auVar56 = vmulps_avx512vl(auVar234,auVar58);
  auVar58 = vmulps_avx512vl(auVar234,auVar105);
  auVar54 = vmulps_avx512vl(auVar234,auVar54);
  auVar229._0_4_ = fVar219 * auVar61._0_4_;
  auVar229._4_4_ = fVar219 * auVar61._4_4_;
  auVar229._8_4_ = fVar219 * auVar61._8_4_;
  auVar229._12_4_ = fVar219 * auVar61._12_4_;
  _local_1e8 = vfmadd231ps_avx512vl(auVar56,auVar48,auVar38);
  _local_1f8 = vfmadd231ps_avx512vl(auVar58,auVar48,auVar39);
  _local_208 = vfmadd231ps_avx512vl(auVar54,auVar48,auVar64);
  _local_218 = vfmadd231ps_avx512vl(auVar229,auVar48,auVar60);
  aVar3 = (ray->super_RayK<1>).org.field_0;
  auVar54 = vsubps_avx512vl(local_1a8,(undefined1  [16])aVar3);
  uVar99 = auVar54._0_4_;
  auVar113._4_4_ = uVar99;
  auVar113._0_4_ = uVar99;
  auVar113._8_4_ = uVar99;
  auVar113._12_4_ = uVar99;
  auVar56 = vshufps_avx(auVar54,auVar54,0x55);
  auVar54 = vshufps_avx(auVar54,auVar54,0xaa);
  aVar4 = (pre->ray_space).vx.field_0;
  aVar5 = (pre->ray_space).vy.field_0;
  fVar219 = (pre->ray_space).vz.field_0.m128[0];
  fVar203 = (pre->ray_space).vz.field_0.m128[1];
  fVar214 = (pre->ray_space).vz.field_0.m128[2];
  fVar215 = (pre->ray_space).vz.field_0.m128[3];
  auVar106._0_4_ = fVar219 * auVar54._0_4_;
  auVar106._4_4_ = fVar203 * auVar54._4_4_;
  auVar106._8_4_ = fVar214 * auVar54._8_4_;
  auVar106._12_4_ = fVar215 * auVar54._12_4_;
  auVar56 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar5,auVar56);
  auVar55 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar4,auVar113);
  auVar54 = vsubps_avx512vl(local_1b8,(undefined1  [16])aVar3);
  uVar99 = auVar54._0_4_;
  auVar116._4_4_ = uVar99;
  auVar116._0_4_ = uVar99;
  auVar116._8_4_ = uVar99;
  auVar116._12_4_ = uVar99;
  auVar56 = vshufps_avx(auVar54,auVar54,0x55);
  auVar54 = vshufps_avx(auVar54,auVar54,0xaa);
  auVar114._0_4_ = fVar219 * auVar54._0_4_;
  auVar114._4_4_ = fVar203 * auVar54._4_4_;
  auVar114._8_4_ = fVar214 * auVar54._8_4_;
  auVar114._12_4_ = fVar215 * auVar54._12_4_;
  auVar56 = vfmadd231ps_fma(auVar114,(undefined1  [16])aVar5,auVar56);
  auVar62 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar4,auVar116);
  auVar54 = vsubps_avx512vl(local_1c8,(undefined1  [16])aVar3);
  uVar99 = auVar54._0_4_;
  auVar152._4_4_ = uVar99;
  auVar152._0_4_ = uVar99;
  auVar152._8_4_ = uVar99;
  auVar152._12_4_ = uVar99;
  auVar56 = vshufps_avx(auVar54,auVar54,0x55);
  auVar54 = vshufps_avx(auVar54,auVar54,0xaa);
  auVar117._0_4_ = fVar219 * auVar54._0_4_;
  auVar117._4_4_ = fVar203 * auVar54._4_4_;
  auVar117._8_4_ = fVar214 * auVar54._8_4_;
  auVar117._12_4_ = fVar215 * auVar54._12_4_;
  auVar56 = vfmadd231ps_fma(auVar117,(undefined1  [16])aVar5,auVar56);
  auVar63 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar4,auVar152);
  auVar54 = vsubps_avx(local_1d8,(undefined1  [16])aVar3);
  uVar99 = auVar54._0_4_;
  auVar172._4_4_ = uVar99;
  auVar172._0_4_ = uVar99;
  auVar172._8_4_ = uVar99;
  auVar172._12_4_ = uVar99;
  auVar56 = vshufps_avx(auVar54,auVar54,0x55);
  auVar54 = vshufps_avx(auVar54,auVar54,0xaa);
  auVar153._0_4_ = fVar219 * auVar54._0_4_;
  auVar153._4_4_ = fVar203 * auVar54._4_4_;
  auVar153._8_4_ = fVar214 * auVar54._8_4_;
  auVar153._12_4_ = fVar215 * auVar54._12_4_;
  auVar56 = vfmadd231ps_fma(auVar153,(undefined1  [16])aVar5,auVar56);
  auVar64 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar4,auVar172);
  auVar54 = vsubps_avx512vl(_local_1e8,(undefined1  [16])aVar3);
  uVar99 = auVar54._0_4_;
  auVar181._4_4_ = uVar99;
  auVar181._0_4_ = uVar99;
  auVar181._8_4_ = uVar99;
  auVar181._12_4_ = uVar99;
  auVar56 = vshufps_avx(auVar54,auVar54,0x55);
  auVar54 = vshufps_avx(auVar54,auVar54,0xaa);
  auVar173._0_4_ = auVar54._0_4_ * fVar219;
  auVar173._4_4_ = auVar54._4_4_ * fVar203;
  auVar173._8_4_ = auVar54._8_4_ * fVar214;
  auVar173._12_4_ = auVar54._12_4_ * fVar215;
  auVar56 = vfmadd231ps_fma(auVar173,(undefined1  [16])aVar5,auVar56);
  auVar48 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar4,auVar181);
  auVar54 = vsubps_avx512vl(_local_1f8,(undefined1  [16])aVar3);
  uVar99 = auVar54._0_4_;
  auVar197._4_4_ = uVar99;
  auVar197._0_4_ = uVar99;
  auVar197._8_4_ = uVar99;
  auVar197._12_4_ = uVar99;
  auVar56 = vshufps_avx(auVar54,auVar54,0x55);
  auVar54 = vshufps_avx(auVar54,auVar54,0xaa);
  auVar182._0_4_ = auVar54._0_4_ * fVar219;
  auVar182._4_4_ = auVar54._4_4_ * fVar203;
  auVar182._8_4_ = auVar54._8_4_ * fVar214;
  auVar182._12_4_ = auVar54._12_4_ * fVar215;
  auVar56 = vfmadd231ps_fma(auVar182,(undefined1  [16])aVar5,auVar56);
  auVar45 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar4,auVar197);
  auVar54 = vsubps_avx512vl(_local_208,(undefined1  [16])aVar3);
  uVar99 = auVar54._0_4_;
  auVar204._4_4_ = uVar99;
  auVar204._0_4_ = uVar99;
  auVar204._8_4_ = uVar99;
  auVar204._12_4_ = uVar99;
  auVar56 = vshufps_avx(auVar54,auVar54,0x55);
  auVar54 = vshufps_avx(auVar54,auVar54,0xaa);
  auVar198._0_4_ = auVar54._0_4_ * fVar219;
  auVar198._4_4_ = auVar54._4_4_ * fVar203;
  auVar198._8_4_ = auVar54._8_4_ * fVar214;
  auVar198._12_4_ = auVar54._12_4_ * fVar215;
  auVar56 = vfmadd231ps_fma(auVar198,(undefined1  [16])aVar5,auVar56);
  auVar46 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar4,auVar204);
  auVar54 = vsubps_avx(_local_218,(undefined1  [16])aVar3);
  uVar99 = auVar54._0_4_;
  auVar205._4_4_ = uVar99;
  auVar205._0_4_ = uVar99;
  auVar205._8_4_ = uVar99;
  auVar205._12_4_ = uVar99;
  auVar56 = vshufps_avx(auVar54,auVar54,0x55);
  auVar54 = vshufps_avx(auVar54,auVar54,0xaa);
  auVar130._0_4_ = fVar219 * auVar54._0_4_;
  auVar130._4_4_ = fVar203 * auVar54._4_4_;
  auVar130._8_4_ = fVar214 * auVar54._8_4_;
  auVar130._12_4_ = fVar215 * auVar54._12_4_;
  auVar56 = vfmadd231ps_fma(auVar130,(undefined1  [16])aVar5,auVar56);
  auVar47 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar4,auVar205);
  local_318 = vmovlhps_avx(auVar55,auVar48);
  local_268 = vmovlhps_avx(auVar62,auVar45);
  local_278 = vmovlhps_avx512f(auVar63,auVar46);
  _local_f8 = vmovlhps_avx512f(auVar64,auVar47);
  auVar54 = vminps_avx(local_318,local_268);
  auVar56 = vmaxps_avx(local_318,local_268);
  auVar58 = vminps_avx512vl(local_278,_local_f8);
  auVar54 = vminps_avx(auVar54,auVar58);
  auVar58 = vmaxps_avx512vl(local_278,_local_f8);
  auVar56 = vmaxps_avx(auVar56,auVar58);
  auVar58 = vshufpd_avx(auVar54,auVar54,3);
  auVar61 = vshufpd_avx(auVar56,auVar56,3);
  auVar54 = vminps_avx(auVar54,auVar58);
  auVar56 = vmaxps_avx(auVar56,auVar61);
  auVar54 = vandps_avx512vl(auVar54,auVar250._0_16_);
  auVar56 = vandps_avx512vl(auVar56,auVar250._0_16_);
  auVar56 = vmaxps_avx(auVar54,auVar56);
  auVar54 = vmovshdup_avx(auVar56);
  auVar56 = vmaxss_avx(auVar54,auVar56);
  lVar30 = uVar33 + 0xf;
  fVar219 = auVar56._0_4_ * 9.536743e-07;
  local_288._8_8_ = auVar55._0_8_;
  local_288._0_8_ = auVar55._0_8_;
  local_298._8_8_ = auVar62._0_8_;
  local_298._0_8_ = auVar62._0_8_;
  local_2a8 = vmovddup_avx512vl(auVar63);
  local_2b8 = vmovddup_avx512vl(auVar64);
  register0x00001348 = auVar48._0_8_;
  local_2c8 = auVar48._0_8_;
  register0x00001388 = auVar45._0_8_;
  local_2d8 = auVar45._0_8_;
  register0x00001408 = auVar46._0_8_;
  local_2e8 = auVar46._0_8_;
  register0x00001448 = auVar47._0_8_;
  local_2f8 = auVar47._0_8_;
  local_108 = ZEXT416((uint)fVar219);
  auVar107._4_4_ = fVar219;
  auVar107._0_4_ = fVar219;
  auVar107._8_4_ = fVar219;
  auVar107._12_4_ = fVar219;
  local_78._16_4_ = fVar219;
  local_78._0_16_ = auVar107;
  local_78._20_4_ = fVar219;
  local_78._24_4_ = fVar219;
  local_78._28_4_ = fVar219;
  auVar16._8_4_ = 0x80000000;
  auVar16._0_8_ = 0x8000000080000000;
  auVar16._12_4_ = 0x80000000;
  auVar56 = vxorps_avx512vl(auVar107,auVar16);
  local_98 = auVar56._0_4_;
  uStack_94 = local_98;
  uStack_90 = local_98;
  uStack_8c = local_98;
  uStack_88 = local_98;
  uStack_84 = local_98;
  uStack_80 = local_98;
  uStack_7c = local_98;
  local_c8 = vsubps_avx(local_268,local_318);
  local_d8 = vsubps_avx512vl(local_278,local_268);
  local_e8 = vsubps_avx512vl(_local_f8,local_278);
  local_118 = vsubps_avx512vl(_local_1e8,local_1a8);
  local_128 = vsubps_avx512vl(_local_1f8,local_1b8);
  local_138 = vsubps_avx512vl(_local_208,local_1c8);
  _local_148 = vsubps_avx(_local_218,local_1d8);
  uVar26 = 0;
  auVar56 = ZEXT816(0x3f80000000000000);
  auVar40 = auVar56;
LAB_018b86fb:
  auVar54 = vshufps_avx(auVar40,auVar40,0x50);
  auVar235._8_4_ = 0x3f800000;
  auVar235._0_8_ = 0x3f8000003f800000;
  auVar235._12_4_ = 0x3f800000;
  auVar238._16_4_ = 0x3f800000;
  auVar238._0_16_ = auVar235;
  auVar238._20_4_ = 0x3f800000;
  auVar238._24_4_ = 0x3f800000;
  auVar238._28_4_ = 0x3f800000;
  auVar58 = vsubps_avx(auVar235,auVar54);
  fVar219 = auVar54._0_4_;
  auVar131._0_4_ = local_2c8._0_4_ * fVar219;
  fVar203 = auVar54._4_4_;
  auVar131._4_4_ = local_2c8._4_4_ * fVar203;
  fVar214 = auVar54._8_4_;
  auVar131._8_4_ = local_2c8._8_4_ * fVar214;
  fVar215 = auVar54._12_4_;
  auVar131._12_4_ = local_2c8._12_4_ * fVar215;
  auVar139._0_4_ = local_2d8._0_4_ * fVar219;
  auVar139._4_4_ = local_2d8._4_4_ * fVar203;
  auVar139._8_4_ = local_2d8._8_4_ * fVar214;
  auVar139._12_4_ = local_2d8._12_4_ * fVar215;
  auVar154._0_4_ = local_2e8._0_4_ * fVar219;
  auVar154._4_4_ = local_2e8._4_4_ * fVar203;
  auVar154._8_4_ = local_2e8._8_4_ * fVar214;
  auVar154._12_4_ = local_2e8._12_4_ * fVar215;
  auVar118._0_4_ = local_2f8._0_4_ * fVar219;
  auVar118._4_4_ = local_2f8._4_4_ * fVar203;
  auVar118._8_4_ = local_2f8._8_4_ * fVar214;
  auVar118._12_4_ = local_2f8._12_4_ * fVar215;
  auVar61 = vfmadd231ps_fma(auVar131,auVar58,local_288);
  auVar55 = vfmadd231ps_fma(auVar139,auVar58,local_298);
  auVar62 = vfmadd231ps_avx512vl(auVar154,auVar58,local_2a8);
  auVar58 = vfmadd231ps_avx512vl(auVar118,local_2b8,auVar58);
  auVar54 = vmovshdup_avx(auVar56);
  fVar203 = auVar56._0_4_;
  fVar219 = (auVar54._0_4_ - fVar203) * 0.04761905;
  auVar146._4_4_ = fVar203;
  auVar146._0_4_ = fVar203;
  auVar146._8_4_ = fVar203;
  auVar146._12_4_ = fVar203;
  auVar146._16_4_ = fVar203;
  auVar146._20_4_ = fVar203;
  auVar146._24_4_ = fVar203;
  auVar146._28_4_ = fVar203;
  auVar75._0_8_ = auVar54._0_8_;
  auVar75._8_8_ = auVar75._0_8_;
  auVar75._16_8_ = auVar75._0_8_;
  auVar75._24_8_ = auVar75._0_8_;
  auVar84 = vsubps_avx(auVar75,auVar146);
  uVar99 = auVar61._0_4_;
  auVar128._4_4_ = uVar99;
  auVar128._0_4_ = uVar99;
  auVar128._8_4_ = uVar99;
  auVar128._12_4_ = uVar99;
  auVar128._16_4_ = uVar99;
  auVar128._20_4_ = uVar99;
  auVar128._24_4_ = uVar99;
  auVar128._28_4_ = uVar99;
  auVar76._8_4_ = 1;
  auVar76._0_8_ = 0x100000001;
  auVar76._12_4_ = 1;
  auVar76._16_4_ = 1;
  auVar76._20_4_ = 1;
  auVar76._24_4_ = 1;
  auVar76._28_4_ = 1;
  auVar83 = ZEXT1632(auVar61);
  auVar80 = vpermps_avx2(auVar76,auVar83);
  auVar65 = vbroadcastss_avx512vl(auVar55);
  auVar81 = ZEXT1632(auVar55);
  auVar66 = vpermps_avx512vl(auVar76,auVar81);
  auVar67 = vbroadcastss_avx512vl(auVar62);
  auVar82 = ZEXT1632(auVar62);
  auVar68 = vpermps_avx512vl(auVar76,auVar82);
  auVar69 = vbroadcastss_avx512vl(auVar58);
  auVar79 = ZEXT1632(auVar58);
  auVar70 = vpermps_avx512vl(auVar76,auVar79);
  auVar201._4_4_ = fVar219;
  auVar201._0_4_ = fVar219;
  auVar201._8_4_ = fVar219;
  auVar201._12_4_ = fVar219;
  auVar201._16_4_ = fVar219;
  auVar201._20_4_ = fVar219;
  auVar201._24_4_ = fVar219;
  auVar201._28_4_ = fVar219;
  auVar77._8_4_ = 2;
  auVar77._0_8_ = 0x200000002;
  auVar77._12_4_ = 2;
  auVar77._16_4_ = 2;
  auVar77._20_4_ = 2;
  auVar77._24_4_ = 2;
  auVar77._28_4_ = 2;
  auVar71 = vpermps_avx512vl(auVar77,auVar83);
  auVar72 = vbroadcastss_avx512vl(ZEXT416(3));
  auVar73 = vpermps_avx512vl(auVar72,auVar83);
  auVar74 = vpermps_avx512vl(auVar77,auVar81);
  auVar75 = vpermps_avx512vl(auVar72,auVar81);
  auVar83 = vpermps_avx2(auVar77,auVar82);
  auVar76 = vpermps_avx512vl(auVar72,auVar82);
  auVar77 = vpermps_avx512vl(auVar77,auVar79);
  auVar78 = vpermps_avx512vl(auVar72,auVar79);
  auVar54 = vfmadd132ps_fma(auVar84,auVar146,_DAT_01f7b040);
  auVar84 = vsubps_avx(auVar238,ZEXT1632(auVar54));
  auVar72 = vmulps_avx512vl(auVar65,ZEXT1632(auVar54));
  auVar81 = ZEXT1632(auVar54);
  auVar79 = vmulps_avx512vl(auVar66,auVar81);
  auVar58 = vfmadd231ps_fma(auVar72,auVar84,auVar128);
  auVar61 = vfmadd231ps_fma(auVar79,auVar84,auVar80);
  auVar72 = vmulps_avx512vl(auVar67,auVar81);
  auVar79 = vmulps_avx512vl(auVar68,auVar81);
  auVar65 = vfmadd231ps_avx512vl(auVar72,auVar84,auVar65);
  auVar66 = vfmadd231ps_avx512vl(auVar79,auVar84,auVar66);
  auVar72 = vmulps_avx512vl(auVar69,auVar81);
  auVar128 = ZEXT1632(auVar54);
  auVar70 = vmulps_avx512vl(auVar70,auVar128);
  auVar67 = vfmadd231ps_avx512vl(auVar72,auVar84,auVar67);
  auVar68 = vfmadd231ps_avx512vl(auVar70,auVar84,auVar68);
  fVar214 = auVar54._0_4_;
  fVar215 = auVar54._4_4_;
  auVar72._4_4_ = fVar215 * auVar65._4_4_;
  auVar72._0_4_ = fVar214 * auVar65._0_4_;
  fVar216 = auVar54._8_4_;
  auVar72._8_4_ = fVar216 * auVar65._8_4_;
  fVar217 = auVar54._12_4_;
  auVar72._12_4_ = fVar217 * auVar65._12_4_;
  auVar72._16_4_ = auVar65._16_4_ * 0.0;
  auVar72._20_4_ = auVar65._20_4_ * 0.0;
  auVar72._24_4_ = auVar65._24_4_ * 0.0;
  auVar72._28_4_ = fVar203;
  auVar79._4_4_ = fVar215 * auVar66._4_4_;
  auVar79._0_4_ = fVar214 * auVar66._0_4_;
  auVar79._8_4_ = fVar216 * auVar66._8_4_;
  auVar79._12_4_ = fVar217 * auVar66._12_4_;
  auVar79._16_4_ = auVar66._16_4_ * 0.0;
  auVar79._20_4_ = auVar66._20_4_ * 0.0;
  auVar79._24_4_ = auVar66._24_4_ * 0.0;
  auVar79._28_4_ = auVar80._28_4_;
  auVar58 = vfmadd231ps_fma(auVar72,auVar84,ZEXT1632(auVar58));
  auVar61 = vfmadd231ps_fma(auVar79,auVar84,ZEXT1632(auVar61));
  auVar85._0_4_ = fVar214 * auVar67._0_4_;
  auVar85._4_4_ = fVar215 * auVar67._4_4_;
  auVar85._8_4_ = fVar216 * auVar67._8_4_;
  auVar85._12_4_ = fVar217 * auVar67._12_4_;
  auVar85._16_4_ = auVar67._16_4_ * 0.0;
  auVar85._20_4_ = auVar67._20_4_ * 0.0;
  auVar85._24_4_ = auVar67._24_4_ * 0.0;
  auVar85._28_4_ = 0;
  auVar81._4_4_ = fVar215 * auVar68._4_4_;
  auVar81._0_4_ = fVar214 * auVar68._0_4_;
  auVar81._8_4_ = fVar216 * auVar68._8_4_;
  auVar81._12_4_ = fVar217 * auVar68._12_4_;
  auVar81._16_4_ = auVar68._16_4_ * 0.0;
  auVar81._20_4_ = auVar68._20_4_ * 0.0;
  auVar81._24_4_ = auVar68._24_4_ * 0.0;
  auVar81._28_4_ = auVar67._28_4_;
  auVar55 = vfmadd231ps_fma(auVar85,auVar84,auVar65);
  auVar62 = vfmadd231ps_fma(auVar81,auVar84,auVar66);
  auVar82._28_4_ = auVar66._28_4_;
  auVar82._0_28_ =
       ZEXT1628(CONCAT412(fVar217 * auVar62._12_4_,
                          CONCAT48(fVar216 * auVar62._8_4_,
                                   CONCAT44(fVar215 * auVar62._4_4_,fVar214 * auVar62._0_4_))));
  auVar63 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar217 * auVar55._12_4_,
                                               CONCAT48(fVar216 * auVar55._8_4_,
                                                        CONCAT44(fVar215 * auVar55._4_4_,
                                                                 fVar214 * auVar55._0_4_)))),auVar84
                            ,ZEXT1632(auVar58));
  auVar64 = vfmadd231ps_fma(auVar82,auVar84,ZEXT1632(auVar61));
  auVar80 = vsubps_avx(ZEXT1632(auVar55),ZEXT1632(auVar58));
  auVar65 = vsubps_avx(ZEXT1632(auVar62),ZEXT1632(auVar61));
  auVar66 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar80 = vmulps_avx512vl(auVar80,auVar66);
  auVar65 = vmulps_avx512vl(auVar65,auVar66);
  auVar191._0_4_ = fVar219 * auVar80._0_4_;
  auVar191._4_4_ = fVar219 * auVar80._4_4_;
  auVar191._8_4_ = fVar219 * auVar80._8_4_;
  auVar191._12_4_ = fVar219 * auVar80._12_4_;
  auVar191._16_4_ = fVar219 * auVar80._16_4_;
  auVar191._20_4_ = fVar219 * auVar80._20_4_;
  auVar191._24_4_ = fVar219 * auVar80._24_4_;
  auVar191._28_4_ = 0;
  auVar80 = vmulps_avx512vl(auVar201,auVar65);
  auVar61 = vxorps_avx512vl(auVar69._0_16_,auVar69._0_16_);
  auVar65 = vpermt2ps_avx512vl(ZEXT1632(auVar63),_DAT_01fb9fc0,ZEXT1632(auVar61));
  auVar67 = vpermt2ps_avx512vl(ZEXT1632(auVar64),_DAT_01fb9fc0,ZEXT1632(auVar61));
  auVar123._0_4_ = auVar191._0_4_ + auVar63._0_4_;
  auVar123._4_4_ = auVar191._4_4_ + auVar63._4_4_;
  auVar123._8_4_ = auVar191._8_4_ + auVar63._8_4_;
  auVar123._12_4_ = auVar191._12_4_ + auVar63._12_4_;
  auVar123._16_4_ = auVar191._16_4_ + 0.0;
  auVar123._20_4_ = auVar191._20_4_ + 0.0;
  auVar123._24_4_ = auVar191._24_4_ + 0.0;
  auVar123._28_4_ = 0;
  auVar85 = ZEXT1632(auVar61);
  auVar68 = vpermt2ps_avx512vl(auVar191,_DAT_01fb9fc0,auVar85);
  auVar69 = vaddps_avx512vl(ZEXT1632(auVar64),auVar80);
  auVar70 = vpermt2ps_avx512vl(auVar80,_DAT_01fb9fc0,auVar85);
  auVar80 = vsubps_avx(auVar65,auVar68);
  auVar68 = vsubps_avx512vl(auVar67,auVar70);
  auVar70 = vmulps_avx512vl(auVar74,auVar128);
  auVar72 = vmulps_avx512vl(auVar75,auVar128);
  auVar70 = vfmadd231ps_avx512vl(auVar70,auVar84,auVar71);
  auVar72 = vfmadd231ps_avx512vl(auVar72,auVar84,auVar73);
  auVar79 = vmulps_avx512vl(auVar83,auVar128);
  auVar81 = vmulps_avx512vl(auVar76,auVar128);
  auVar79 = vfmadd231ps_avx512vl(auVar79,auVar84,auVar74);
  auVar81 = vfmadd231ps_avx512vl(auVar81,auVar84,auVar75);
  auVar82 = vmulps_avx512vl(auVar77,auVar128);
  auVar71 = vmulps_avx512vl(auVar78,auVar128);
  auVar58 = vfmadd231ps_fma(auVar82,auVar84,auVar83);
  auVar83 = vfmadd231ps_avx512vl(auVar71,auVar84,auVar76);
  auVar82 = vmulps_avx512vl(auVar128,auVar79);
  auVar73 = ZEXT1632(auVar54);
  auVar71 = vmulps_avx512vl(auVar73,auVar81);
  auVar70 = vfmadd231ps_avx512vl(auVar82,auVar84,auVar70);
  auVar72 = vfmadd231ps_avx512vl(auVar71,auVar84,auVar72);
  auVar83 = vmulps_avx512vl(auVar73,auVar83);
  auVar79 = vfmadd231ps_avx512vl
                      (ZEXT1632(CONCAT412(fVar217 * auVar58._12_4_,
                                          CONCAT48(fVar216 * auVar58._8_4_,
                                                   CONCAT44(fVar215 * auVar58._4_4_,
                                                            fVar214 * auVar58._0_4_)))),auVar84,
                       auVar79);
  auVar83 = vfmadd231ps_avx512vl(auVar83,auVar84,auVar81);
  auVar71._4_4_ = fVar215 * auVar79._4_4_;
  auVar71._0_4_ = fVar214 * auVar79._0_4_;
  auVar71._8_4_ = fVar216 * auVar79._8_4_;
  auVar71._12_4_ = fVar217 * auVar79._12_4_;
  auVar71._16_4_ = auVar79._16_4_ * 0.0;
  auVar71._20_4_ = auVar79._20_4_ * 0.0;
  auVar71._24_4_ = auVar79._24_4_ * 0.0;
  auVar71._28_4_ = auVar76._28_4_;
  auVar81 = vmulps_avx512vl(auVar73,auVar83);
  auVar82 = vfmadd231ps_avx512vl(auVar71,auVar84,auVar70);
  auVar81 = vfmadd231ps_avx512vl(auVar81,auVar72,auVar84);
  auVar84 = vsubps_avx512vl(auVar79,auVar70);
  auVar83 = vsubps_avx512vl(auVar83,auVar72);
  auVar84 = vmulps_avx512vl(auVar84,auVar66);
  auVar83 = vmulps_avx512vl(auVar83,auVar66);
  fVar203 = fVar219 * auVar84._0_4_;
  fVar214 = fVar219 * auVar84._4_4_;
  auVar73._4_4_ = fVar214;
  auVar73._0_4_ = fVar203;
  fVar215 = fVar219 * auVar84._8_4_;
  auVar73._8_4_ = fVar215;
  fVar216 = fVar219 * auVar84._12_4_;
  auVar73._12_4_ = fVar216;
  fVar217 = fVar219 * auVar84._16_4_;
  auVar73._16_4_ = fVar217;
  fVar218 = fVar219 * auVar84._20_4_;
  auVar73._20_4_ = fVar218;
  fVar219 = fVar219 * auVar84._24_4_;
  auVar73._24_4_ = fVar219;
  auVar73._28_4_ = auVar84._28_4_;
  auVar83 = vmulps_avx512vl(auVar201,auVar83);
  auVar66 = vpermt2ps_avx512vl(auVar82,_DAT_01fb9fc0,auVar85);
  auVar70 = vpermt2ps_avx512vl(auVar81,_DAT_01fb9fc0,auVar85);
  auVar202._0_4_ = auVar82._0_4_ + fVar203;
  auVar202._4_4_ = auVar82._4_4_ + fVar214;
  auVar202._8_4_ = auVar82._8_4_ + fVar215;
  auVar202._12_4_ = auVar82._12_4_ + fVar216;
  auVar202._16_4_ = auVar82._16_4_ + fVar217;
  auVar202._20_4_ = auVar82._20_4_ + fVar218;
  auVar202._24_4_ = auVar82._24_4_ + fVar219;
  auVar202._28_4_ = auVar82._28_4_ + auVar84._28_4_;
  auVar84 = vpermt2ps_avx512vl(auVar73,_DAT_01fb9fc0,ZEXT1632(auVar61));
  auVar72 = vaddps_avx512vl(auVar81,auVar83);
  auVar83 = vpermt2ps_avx512vl(auVar83,_DAT_01fb9fc0,ZEXT1632(auVar61));
  auVar84 = vsubps_avx(auVar66,auVar84);
  auVar83 = vsubps_avx512vl(auVar70,auVar83);
  auVar128 = ZEXT1632(auVar63);
  auVar79 = vsubps_avx512vl(auVar82,auVar128);
  auVar146 = ZEXT1632(auVar64);
  auVar71 = vsubps_avx512vl(auVar81,auVar146);
  auVar73 = vsubps_avx512vl(auVar66,auVar65);
  auVar79 = vaddps_avx512vl(auVar79,auVar73);
  auVar73 = vsubps_avx512vl(auVar70,auVar67);
  auVar71 = vaddps_avx512vl(auVar71,auVar73);
  auVar73 = vmulps_avx512vl(auVar146,auVar79);
  auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar128,auVar71);
  auVar74 = vmulps_avx512vl(auVar69,auVar79);
  auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar123,auVar71);
  auVar75 = vmulps_avx512vl(auVar68,auVar79);
  auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar80,auVar71);
  auVar76 = vmulps_avx512vl(auVar67,auVar79);
  auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar65,auVar71);
  auVar77 = vmulps_avx512vl(auVar81,auVar79);
  auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar82,auVar71);
  auVar78 = vmulps_avx512vl(auVar72,auVar79);
  auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar202,auVar71);
  auVar85 = vmulps_avx512vl(auVar83,auVar79);
  auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar84,auVar71);
  auVar79 = vmulps_avx512vl(auVar70,auVar79);
  auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar66,auVar71);
  auVar71 = vminps_avx512vl(auVar73,auVar74);
  auVar73 = vmaxps_avx512vl(auVar73,auVar74);
  auVar74 = vminps_avx512vl(auVar75,auVar76);
  auVar71 = vminps_avx512vl(auVar71,auVar74);
  auVar74 = vmaxps_avx512vl(auVar75,auVar76);
  auVar73 = vmaxps_avx512vl(auVar73,auVar74);
  auVar74 = vminps_avx512vl(auVar77,auVar78);
  auVar75 = vmaxps_avx512vl(auVar77,auVar78);
  auVar76 = vminps_avx512vl(auVar85,auVar79);
  auVar74 = vminps_avx512vl(auVar74,auVar76);
  auVar71 = vminps_avx512vl(auVar71,auVar74);
  auVar79 = vmaxps_avx512vl(auVar85,auVar79);
  auVar79 = vmaxps_avx512vl(auVar75,auVar79);
  auVar79 = vmaxps_avx512vl(auVar73,auVar79);
  uVar14 = vcmpps_avx512vl(auVar71,local_78,2);
  auVar74._4_4_ = uStack_94;
  auVar74._0_4_ = local_98;
  auVar74._8_4_ = uStack_90;
  auVar74._12_4_ = uStack_8c;
  auVar74._16_4_ = uStack_88;
  auVar74._20_4_ = uStack_84;
  auVar74._24_4_ = uStack_80;
  auVar74._28_4_ = uStack_7c;
  uVar15 = vcmpps_avx512vl(auVar79,auVar74,5);
  bVar24 = (byte)uVar14 & (byte)uVar15 & 0x7f;
  if (bVar24 != 0) {
    auVar79 = vsubps_avx512vl(auVar65,auVar128);
    auVar71 = vsubps_avx512vl(auVar67,auVar146);
    auVar73 = vsubps_avx512vl(auVar66,auVar82);
    auVar79 = vaddps_avx512vl(auVar79,auVar73);
    auVar73 = vsubps_avx512vl(auVar70,auVar81);
    auVar71 = vaddps_avx512vl(auVar71,auVar73);
    auVar73 = vmulps_avx512vl(auVar146,auVar79);
    auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar71,auVar128);
    auVar69 = vmulps_avx512vl(auVar69,auVar79);
    auVar69 = vfnmadd213ps_avx512vl(auVar123,auVar71,auVar69);
    auVar68 = vmulps_avx512vl(auVar68,auVar79);
    auVar68 = vfnmadd213ps_avx512vl(auVar80,auVar71,auVar68);
    auVar80 = vmulps_avx512vl(auVar67,auVar79);
    auVar67 = vfnmadd231ps_avx512vl(auVar80,auVar71,auVar65);
    auVar80 = vmulps_avx512vl(auVar81,auVar79);
    auVar81 = vfnmadd231ps_avx512vl(auVar80,auVar71,auVar82);
    auVar80 = vmulps_avx512vl(auVar72,auVar79);
    auVar72 = vfnmadd213ps_avx512vl(auVar202,auVar71,auVar80);
    auVar80 = vmulps_avx512vl(auVar83,auVar79);
    auVar82 = vfnmadd213ps_avx512vl(auVar84,auVar71,auVar80);
    auVar84 = vmulps_avx512vl(auVar70,auVar79);
    auVar70 = vfnmadd231ps_avx512vl(auVar84,auVar66,auVar71);
    auVar80 = vminps_avx(auVar73,auVar69);
    auVar84 = vmaxps_avx(auVar73,auVar69);
    auVar65 = vminps_avx(auVar68,auVar67);
    auVar65 = vminps_avx(auVar80,auVar65);
    auVar80 = vmaxps_avx(auVar68,auVar67);
    auVar84 = vmaxps_avx(auVar84,auVar80);
    auVar83 = vminps_avx(auVar81,auVar72);
    auVar80 = vmaxps_avx(auVar81,auVar72);
    auVar66 = vminps_avx(auVar82,auVar70);
    auVar83 = vminps_avx(auVar83,auVar66);
    auVar83 = vminps_avx(auVar65,auVar83);
    auVar65 = vmaxps_avx(auVar82,auVar70);
    auVar80 = vmaxps_avx(auVar80,auVar65);
    auVar84 = vmaxps_avx(auVar84,auVar80);
    uVar14 = vcmpps_avx512vl(auVar84,auVar74,5);
    uVar15 = vcmpps_avx512vl(auVar83,local_78,2);
    bVar24 = bVar24 & (byte)uVar14 & (byte)uVar15;
    if (bVar24 != 0) {
      auStack_198[uVar26] = (uint)bVar24;
      uVar14 = vmovlps_avx(auVar56);
      (&uStack_b8)[uVar26] = uVar14;
      uVar2 = vmovlps_avx(auVar40);
      auStack_58[uVar26] = uVar2;
      uVar26 = (ulong)((int)uVar26 + 1);
    }
  }
  auVar56 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar249 = ZEXT1664(auVar56);
  auVar84 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar246 = ZEXT3264(auVar84);
  auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
  auVar247 = ZEXT1664(auVar56);
  auVar248 = ZEXT3264(_DAT_01fb9fe0);
  auVar84 = _DAT_01fb9fe0;
LAB_018b8bfd:
  do {
    do {
      do {
        auVar58 = auVar251._0_16_;
        auVar61 = auVar253._0_16_;
        auVar54 = auVar249._0_16_;
        if ((int)uVar26 == 0) {
          fVar219 = (ray->super_RayK<1>).tfar;
          auVar22._4_4_ = fVar219;
          auVar22._0_4_ = fVar219;
          auVar22._8_4_ = fVar219;
          auVar22._12_4_ = fVar219;
          uVar14 = vcmpps_avx512vl(local_158,auVar22,2);
          uVar33 = (ulong)((uint)uVar33 & (uint)lVar30 & (uint)uVar14);
          goto LAB_018b7c96;
        }
        uVar25 = (int)uVar26 - 1;
        uVar27 = (ulong)uVar25;
        uVar7 = auStack_198[uVar27];
        auVar40._8_8_ = 0;
        auVar40._0_8_ = auStack_58[uVar27];
        uVar2 = 0;
        for (uVar32 = (ulong)uVar7; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
          uVar2 = uVar2 + 1;
        }
        uVar29 = uVar7 - 1 & uVar7;
        bVar36 = uVar29 == 0;
        auStack_198[uVar27] = uVar29;
        if (bVar36) {
          uVar26 = (ulong)uVar25;
        }
        auVar108._8_8_ = 0;
        auVar108._0_8_ = uVar2;
        auVar56 = vpunpcklqdq_avx(auVar108,ZEXT416((int)uVar2 + 1));
        auVar56 = vcvtqq2ps_avx512vl(auVar56);
        auVar56 = vmulps_avx512vl(auVar56,auVar247._0_16_);
        uVar99 = *(undefined4 *)((long)&uStack_b8 + uVar27 * 8 + 4);
        auVar17._4_4_ = uVar99;
        auVar17._0_4_ = uVar99;
        auVar17._8_4_ = uVar99;
        auVar17._12_4_ = uVar99;
        auVar55 = vmulps_avx512vl(auVar56,auVar17);
        auVar56 = vsubps_avx512vl(auVar58,auVar56);
        uVar99 = *(undefined4 *)(&uStack_b8 + uVar27);
        auVar18._4_4_ = uVar99;
        auVar18._0_4_ = uVar99;
        auVar18._8_4_ = uVar99;
        auVar18._12_4_ = uVar99;
        auVar56 = vfmadd231ps_avx512vl(auVar55,auVar56,auVar18);
        auVar55 = vmovshdup_avx(auVar56);
        fVar219 = auVar55._0_4_ - auVar56._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar219));
        if (uVar7 == 0 || bVar36) goto LAB_018b86fb;
        auVar55 = vshufps_avx(auVar40,auVar40,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar219));
        auVar64 = vsubps_avx512vl(auVar58,auVar55);
        fVar203 = auVar55._0_4_;
        auVar140._0_4_ = fVar203 * (float)local_2c8._0_4_;
        fVar214 = auVar55._4_4_;
        auVar140._4_4_ = fVar214 * (float)local_2c8._4_4_;
        fVar215 = auVar55._8_4_;
        auVar140._8_4_ = fVar215 * fStack_2c0;
        fVar216 = auVar55._12_4_;
        auVar140._12_4_ = fVar216 * fStack_2bc;
        auVar155._0_4_ = fVar203 * (float)local_2d8._0_4_;
        auVar155._4_4_ = fVar214 * (float)local_2d8._4_4_;
        auVar155._8_4_ = fVar215 * fStack_2d0;
        auVar155._12_4_ = fVar216 * fStack_2cc;
        auVar163._0_4_ = fVar203 * (float)local_2e8._0_4_;
        auVar163._4_4_ = fVar214 * (float)local_2e8._4_4_;
        auVar163._8_4_ = fVar215 * fStack_2e0;
        auVar163._12_4_ = fVar216 * fStack_2dc;
        auVar124._0_4_ = fVar203 * (float)local_2f8._0_4_;
        auVar124._4_4_ = fVar214 * (float)local_2f8._4_4_;
        auVar124._8_4_ = fVar215 * fStack_2f0;
        auVar124._12_4_ = fVar216 * fStack_2ec;
        auVar55 = vfmadd231ps_fma(auVar140,auVar64,local_288);
        auVar62 = vfmadd231ps_fma(auVar155,auVar64,local_298);
        auVar63 = vfmadd231ps_fma(auVar163,auVar64,local_2a8);
        auVar64 = vfmadd231ps_fma(auVar124,auVar64,local_2b8);
        auVar78._16_16_ = auVar55;
        auVar78._0_16_ = auVar55;
        auVar147._16_16_ = auVar62;
        auVar147._0_16_ = auVar62;
        auVar159._16_16_ = auVar63;
        auVar159._0_16_ = auVar63;
        auVar80 = vpermps_avx512vl(auVar248._0_32_,ZEXT1632(auVar56));
        auVar84 = vsubps_avx(auVar147,auVar78);
        auVar62 = vfmadd213ps_fma(auVar84,auVar80,auVar78);
        auVar84 = vsubps_avx(auVar159,auVar147);
        auVar48 = vfmadd213ps_fma(auVar84,auVar80,auVar147);
        auVar55 = vsubps_avx(auVar64,auVar63);
        auVar148._16_16_ = auVar55;
        auVar148._0_16_ = auVar55;
        auVar55 = vfmadd213ps_fma(auVar148,auVar80,auVar159);
        auVar84 = vsubps_avx(ZEXT1632(auVar48),ZEXT1632(auVar62));
        auVar62 = vfmadd213ps_fma(auVar84,auVar80,ZEXT1632(auVar62));
        auVar84 = vsubps_avx(ZEXT1632(auVar55),ZEXT1632(auVar48));
        auVar55 = vfmadd213ps_fma(auVar84,auVar80,ZEXT1632(auVar48));
        auVar84 = vsubps_avx(ZEXT1632(auVar55),ZEXT1632(auVar62));
        auVar52 = vfmadd231ps_fma(ZEXT1632(auVar62),auVar84,auVar80);
        auVar84 = vmulps_avx512vl(auVar84,auVar246._0_32_);
        auVar55 = vmulss_avx512f(ZEXT416((uint)fVar219),SUB6416(ZEXT464(0x3eaaaaab),0));
        fVar203 = auVar55._0_4_;
        auVar164._0_8_ =
             CONCAT44(auVar52._4_4_ + fVar203 * auVar84._4_4_,
                      auVar52._0_4_ + fVar203 * auVar84._0_4_);
        auVar164._8_4_ = auVar52._8_4_ + fVar203 * auVar84._8_4_;
        auVar164._12_4_ = auVar52._12_4_ + fVar203 * auVar84._12_4_;
        auVar141._0_4_ = fVar203 * auVar84._16_4_;
        auVar141._4_4_ = fVar203 * auVar84._20_4_;
        auVar141._8_4_ = fVar203 * auVar84._24_4_;
        auVar141._12_4_ = fVar203 * auVar84._28_4_;
        auVar49 = vsubps_avx((undefined1  [16])0x0,auVar141);
        auVar48 = vshufpd_avx(auVar52,auVar52,3);
        auVar45 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar55 = vsubps_avx(auVar48,auVar52);
        auVar62 = vsubps_avx(auVar45,(undefined1  [16])0x0);
        auVar183._0_4_ = auVar55._0_4_ + auVar62._0_4_;
        auVar183._4_4_ = auVar55._4_4_ + auVar62._4_4_;
        auVar183._8_4_ = auVar55._8_4_ + auVar62._8_4_;
        auVar183._12_4_ = auVar55._12_4_ + auVar62._12_4_;
        auVar55 = vshufps_avx(auVar52,auVar52,0xb1);
        auVar62 = vshufps_avx(auVar164,auVar164,0xb1);
        auVar63 = vshufps_avx(auVar49,auVar49,0xb1);
        auVar64 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar236._4_4_ = auVar183._0_4_;
        auVar236._0_4_ = auVar183._0_4_;
        auVar236._8_4_ = auVar183._0_4_;
        auVar236._12_4_ = auVar183._0_4_;
        auVar46 = vshufps_avx(auVar183,auVar183,0x55);
        fVar203 = auVar46._0_4_;
        auVar199._0_4_ = auVar55._0_4_ * fVar203;
        fVar214 = auVar46._4_4_;
        auVar199._4_4_ = auVar55._4_4_ * fVar214;
        fVar215 = auVar46._8_4_;
        auVar199._8_4_ = auVar55._8_4_ * fVar215;
        fVar216 = auVar46._12_4_;
        auVar199._12_4_ = auVar55._12_4_ * fVar216;
        auVar206._0_4_ = auVar62._0_4_ * fVar203;
        auVar206._4_4_ = auVar62._4_4_ * fVar214;
        auVar206._8_4_ = auVar62._8_4_ * fVar215;
        auVar206._12_4_ = auVar62._12_4_ * fVar216;
        auVar221._0_4_ = auVar63._0_4_ * fVar203;
        auVar221._4_4_ = auVar63._4_4_ * fVar214;
        auVar221._8_4_ = auVar63._8_4_ * fVar215;
        auVar221._12_4_ = auVar63._12_4_ * fVar216;
        auVar184._0_4_ = auVar64._0_4_ * fVar203;
        auVar184._4_4_ = auVar64._4_4_ * fVar214;
        auVar184._8_4_ = auVar64._8_4_ * fVar215;
        auVar184._12_4_ = auVar64._12_4_ * fVar216;
        auVar55 = vfmadd231ps_fma(auVar199,auVar236,auVar52);
        auVar62 = vfmadd231ps_fma(auVar206,auVar236,auVar164);
        auVar50 = vfmadd231ps_fma(auVar221,auVar236,auVar49);
        auVar51 = vfmadd231ps_fma(auVar184,(undefined1  [16])0x0,auVar236);
        auVar46 = vshufpd_avx(auVar55,auVar55,1);
        auVar47 = vshufpd_avx(auVar62,auVar62,1);
        auVar53 = vshufpd_avx512vl(auVar50,auVar50,1);
        auVar59 = vshufpd_avx512vl(auVar51,auVar51,1);
        auVar63 = vminss_avx(auVar55,auVar62);
        auVar55 = vmaxss_avx(auVar62,auVar55);
        auVar64 = vminss_avx(auVar50,auVar51);
        auVar62 = vmaxss_avx(auVar51,auVar50);
        auVar63 = vminss_avx(auVar63,auVar64);
        auVar55 = vmaxss_avx(auVar62,auVar55);
        auVar64 = vminss_avx(auVar46,auVar47);
        auVar62 = vmaxss_avx(auVar47,auVar46);
        auVar46 = vminss_avx512f(auVar53,auVar59);
        auVar47 = vmaxss_avx512f(auVar59,auVar53);
        auVar62 = vmaxss_avx(auVar47,auVar62);
        auVar84._0_16_ = vminss_avx512f(auVar64,auVar46);
        vucomiss_avx512f(auVar63);
        fVar214 = auVar62._0_4_;
        fVar203 = auVar55._0_4_;
        if (4 < (uint)uVar26) {
          bVar37 = fVar214 == -0.0001;
          bVar34 = NAN(fVar214);
          if (fVar214 <= -0.0001) goto LAB_018b8e1b;
          break;
        }
LAB_018b8e1b:
        auVar64 = vucomiss_avx512f(auVar84._0_16_);
        bVar37 = fVar214 <= -0.0001;
        bVar35 = -0.0001 < fVar203;
        bVar34 = bVar37;
        if (!bVar37) break;
        uVar14 = vcmpps_avx512vl(auVar63,auVar64,5);
        uVar15 = vcmpps_avx512vl(auVar84._0_16_,auVar64,5);
        uVar25 = (uint)uVar14 & (uint)uVar15;
        bVar23 = (uVar25 & 1) == 0;
        bVar37 = bVar35 && bVar23;
        bVar34 = bVar35 && (uVar25 & 1) == 0;
      } while (!bVar35 || !bVar23);
      vcmpss_avx512f(auVar63,auVar61,1);
      auVar47 = auVar252._0_16_;
      uVar14 = vcmpss_avx512f(auVar55,auVar61,1);
      bVar35 = (bool)((byte)uVar14 & 1);
      auVar87._16_16_ = auVar84._16_16_;
      auVar87._0_16_ = auVar47;
      iVar98 = auVar252._0_4_;
      auVar86._4_28_ = auVar87._4_28_;
      auVar86._0_4_ = (float)((uint)bVar35 * -0x40800000 + (uint)!bVar35 * iVar98);
      vucomiss_avx512f(auVar86._0_16_);
      bVar34 = (bool)(!bVar37 | bVar34);
      bVar35 = bVar34 == false;
      auVar89._16_16_ = auVar84._16_16_;
      auVar89._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar88._4_28_ = auVar89._4_28_;
      auVar88._0_4_ = (uint)bVar34 * auVar253._0_4_ + (uint)!bVar34 * 0x7f800000;
      auVar46 = auVar88._0_16_;
      auVar91._16_16_ = auVar84._16_16_;
      auVar91._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar90._4_28_ = auVar91._4_28_;
      auVar90._0_4_ = (uint)bVar34 * auVar253._0_4_ + (uint)!bVar34 * -0x800000;
      auVar64 = auVar90._0_16_;
      uVar14 = vcmpss_avx512f(auVar84._0_16_,auVar61,1);
      bVar37 = (bool)((byte)uVar14 & 1);
      auVar93._16_16_ = auVar84._16_16_;
      auVar93._0_16_ = auVar47;
      auVar92._4_28_ = auVar93._4_28_;
      auVar92._0_4_ = (float)((uint)bVar37 * -0x40800000 + (uint)!bVar37 * iVar98);
      vucomiss_avx512f(auVar92._0_16_);
      if ((bVar34) || (bVar35)) {
        auVar50 = vucomiss_avx512f(auVar63);
        if ((bVar34) || (bVar35)) {
          auVar21._8_4_ = 0x80000000;
          auVar21._0_8_ = 0x8000000080000000;
          auVar21._12_4_ = 0x80000000;
          auVar51 = vxorps_avx512vl(auVar63,auVar21);
          auVar63 = vsubss_avx512f(auVar50,auVar63);
          auVar63 = vdivss_avx512f(auVar51,auVar63);
          auVar50 = vsubss_avx512f(auVar47,auVar63);
          auVar63 = vfmadd213ss_avx512f(auVar50,auVar61,auVar63);
          auVar50 = auVar63;
        }
        else {
          auVar50 = vxorps_avx512vl(auVar50,auVar50);
          vucomiss_avx512f(auVar50);
          if ((bVar34) || (auVar63 = auVar47, bVar35)) {
            auVar63 = SUB6416(ZEXT464(0xff800000),0);
            auVar50 = ZEXT416(0x7f800000);
          }
        }
        auVar46 = vminss_avx512f(auVar46,auVar50);
        auVar64 = vmaxss_avx(auVar63,auVar64);
      }
      uVar14 = vcmpss_avx512f(auVar62,auVar61,1);
      bVar37 = (bool)((byte)uVar14 & 1);
      fVar215 = (float)((uint)bVar37 * -0x40800000 + (uint)!bVar37 * iVar98);
      if ((auVar86._0_4_ != fVar215) || (NAN(auVar86._0_4_) || NAN(fVar215))) {
        if ((fVar214 != fVar203) || (NAN(fVar214) || NAN(fVar203))) {
          auVar20._8_4_ = 0x80000000;
          auVar20._0_8_ = 0x8000000080000000;
          auVar20._12_4_ = 0x80000000;
          auVar55 = vxorps_avx512vl(auVar55,auVar20);
          auVar185._0_4_ = auVar55._0_4_ / (fVar214 - fVar203);
          auVar185._4_12_ = auVar55._4_12_;
          auVar55 = vsubss_avx512f(auVar47,auVar185);
          auVar55 = vfmadd213ss_avx512f(auVar55,auVar61,auVar185);
          auVar62 = auVar55;
        }
        else if ((fVar203 != 0.0) ||
                (auVar55 = auVar47, auVar62 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar203))) {
          auVar55 = SUB6416(ZEXT464(0xff800000),0);
          auVar62 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar46 = vminss_avx(auVar46,auVar62);
        auVar64 = vmaxss_avx(auVar55,auVar64);
      }
      bVar37 = auVar92._0_4_ != fVar215;
      auVar55 = vminss_avx512f(auVar46,auVar47);
      auVar95._16_16_ = auVar84._16_16_;
      auVar95._0_16_ = auVar46;
      auVar94._4_28_ = auVar95._4_28_;
      auVar94._0_4_ = (uint)bVar37 * auVar55._0_4_ + (uint)!bVar37 * auVar46._0_4_;
      auVar55 = vmaxss_avx512f(auVar47,auVar64);
      auVar97._16_16_ = auVar84._16_16_;
      auVar97._0_16_ = auVar64;
      auVar96._4_28_ = auVar97._4_28_;
      auVar96._0_4_ = (uint)bVar37 * auVar55._0_4_ + (uint)!bVar37 * auVar64._0_4_;
      auVar55 = vmaxss_avx512f(auVar61,auVar94._0_16_);
      auVar84._0_16_ = vminss_avx512f(auVar96._0_16_,auVar47);
    } while (auVar84._0_4_ < auVar55._0_4_);
    auVar64 = vmaxss_avx512f(auVar61,ZEXT416((uint)(auVar55._0_4_ + -0.1)));
    auVar50 = vminss_avx512f(ZEXT416((uint)(auVar84._0_4_ + 0.1)),auVar47);
    auVar125._0_8_ = auVar52._0_8_;
    auVar125._8_8_ = auVar125._0_8_;
    auVar207._8_8_ = auVar164._0_8_;
    auVar207._0_8_ = auVar164._0_8_;
    auVar222._8_8_ = auVar49._0_8_;
    auVar222._0_8_ = auVar49._0_8_;
    auVar55 = vshufpd_avx(auVar164,auVar164,3);
    auVar62 = vshufpd_avx(auVar49,auVar49,3);
    auVar63 = vshufps_avx(auVar64,auVar50,0);
    auVar49 = vsubps_avx512vl(auVar58,auVar63);
    fVar203 = auVar63._0_4_;
    auVar156._0_4_ = fVar203 * auVar48._0_4_;
    fVar214 = auVar63._4_4_;
    auVar156._4_4_ = fVar214 * auVar48._4_4_;
    fVar215 = auVar63._8_4_;
    auVar156._8_4_ = fVar215 * auVar48._8_4_;
    fVar216 = auVar63._12_4_;
    auVar156._12_4_ = fVar216 * auVar48._12_4_;
    auVar165._0_4_ = fVar203 * auVar55._0_4_;
    auVar165._4_4_ = fVar214 * auVar55._4_4_;
    auVar165._8_4_ = fVar215 * auVar55._8_4_;
    auVar165._12_4_ = fVar216 * auVar55._12_4_;
    auVar241._0_4_ = auVar62._0_4_ * fVar203;
    auVar241._4_4_ = auVar62._4_4_ * fVar214;
    auVar241._8_4_ = auVar62._8_4_ * fVar215;
    auVar241._12_4_ = auVar62._12_4_ * fVar216;
    auVar142._0_4_ = fVar203 * auVar45._0_4_;
    auVar142._4_4_ = fVar214 * auVar45._4_4_;
    auVar142._8_4_ = fVar215 * auVar45._8_4_;
    auVar142._12_4_ = fVar216 * auVar45._12_4_;
    auVar48 = vfmadd231ps_fma(auVar156,auVar49,auVar125);
    auVar45 = vfmadd231ps_fma(auVar165,auVar49,auVar207);
    auVar46 = vfmadd231ps_fma(auVar241,auVar49,auVar222);
    auVar49 = vfmadd231ps_fma(auVar142,auVar49,ZEXT816(0));
    auVar62 = vsubss_avx512f(auVar47,auVar64);
    auVar55 = vmovshdup_avx(auVar40);
    auVar53 = vfmadd231ss_fma(ZEXT416((uint)(auVar55._0_4_ * auVar64._0_4_)),auVar40,auVar62);
    auVar62 = vsubss_avx512f(auVar47,auVar50);
    auVar59 = vfmadd231ss_fma(ZEXT416((uint)(auVar55._0_4_ * auVar50._0_4_)),auVar40,auVar62);
    auVar50 = vdivss_avx512f(auVar47,ZEXT416((uint)fVar219));
    auVar55 = vsubps_avx(auVar45,auVar48);
    auVar63 = vmulps_avx512vl(auVar55,auVar54);
    auVar55 = vsubps_avx(auVar46,auVar45);
    auVar64 = vmulps_avx512vl(auVar55,auVar54);
    auVar55 = vsubps_avx(auVar49,auVar46);
    auVar55 = vmulps_avx512vl(auVar55,auVar54);
    auVar62 = vminps_avx(auVar64,auVar55);
    auVar55 = vmaxps_avx(auVar64,auVar55);
    auVar62 = vminps_avx(auVar63,auVar62);
    auVar55 = vmaxps_avx(auVar63,auVar55);
    auVar63 = vshufpd_avx(auVar62,auVar62,3);
    auVar64 = vshufpd_avx(auVar55,auVar55,3);
    auVar62 = vminps_avx(auVar62,auVar63);
    auVar55 = vmaxps_avx(auVar55,auVar64);
    fVar219 = auVar50._0_4_;
    auVar186._0_4_ = auVar62._0_4_ * fVar219;
    auVar186._4_4_ = auVar62._4_4_ * fVar219;
    auVar186._8_4_ = auVar62._8_4_ * fVar219;
    auVar186._12_4_ = auVar62._12_4_ * fVar219;
    auVar174._0_4_ = fVar219 * auVar55._0_4_;
    auVar174._4_4_ = fVar219 * auVar55._4_4_;
    auVar174._8_4_ = fVar219 * auVar55._8_4_;
    auVar174._12_4_ = fVar219 * auVar55._12_4_;
    auVar50 = vdivss_avx512f(auVar47,ZEXT416((uint)(auVar59._0_4_ - auVar53._0_4_)));
    auVar55 = vshufpd_avx(auVar48,auVar48,3);
    auVar62 = vshufpd_avx(auVar45,auVar45,3);
    auVar63 = vshufpd_avx(auVar46,auVar46,3);
    auVar64 = vshufpd_avx(auVar49,auVar49,3);
    auVar55 = vsubps_avx(auVar55,auVar48);
    auVar48 = vsubps_avx(auVar62,auVar45);
    auVar45 = vsubps_avx(auVar63,auVar46);
    auVar64 = vsubps_avx(auVar64,auVar49);
    auVar62 = vminps_avx(auVar55,auVar48);
    auVar55 = vmaxps_avx(auVar55,auVar48);
    auVar63 = vminps_avx(auVar45,auVar64);
    auVar63 = vminps_avx(auVar62,auVar63);
    auVar62 = vmaxps_avx(auVar45,auVar64);
    auVar55 = vmaxps_avx(auVar55,auVar62);
    fVar219 = auVar50._0_4_;
    auVar223._0_4_ = fVar219 * auVar63._0_4_;
    auVar223._4_4_ = fVar219 * auVar63._4_4_;
    auVar223._8_4_ = fVar219 * auVar63._8_4_;
    auVar223._12_4_ = fVar219 * auVar63._12_4_;
    auVar208._0_4_ = fVar219 * auVar55._0_4_;
    auVar208._4_4_ = fVar219 * auVar55._4_4_;
    auVar208._8_4_ = fVar219 * auVar55._8_4_;
    auVar208._12_4_ = fVar219 * auVar55._12_4_;
    auVar64 = vinsertps_avx(auVar56,auVar53,0x10);
    auVar60 = vpermt2ps_avx512vl(auVar56,_DAT_01fb9f90,auVar59);
    auVar115._0_4_ = auVar64._0_4_ + auVar60._0_4_;
    auVar115._4_4_ = auVar64._4_4_ + auVar60._4_4_;
    auVar115._8_4_ = auVar64._8_4_ + auVar60._8_4_;
    auVar115._12_4_ = auVar64._12_4_ + auVar60._12_4_;
    auVar19._8_4_ = 0x3f000000;
    auVar19._0_8_ = 0x3f0000003f000000;
    auVar19._12_4_ = 0x3f000000;
    auVar50 = vmulps_avx512vl(auVar115,auVar19);
    auVar62 = vshufps_avx(auVar50,auVar50,0x54);
    uVar99 = auVar50._0_4_;
    auVar119._4_4_ = uVar99;
    auVar119._0_4_ = uVar99;
    auVar119._8_4_ = uVar99;
    auVar119._12_4_ = uVar99;
    auVar63 = vfmadd213ps_fma(local_c8,auVar119,local_318);
    auVar48 = vfmadd213ps_fma(local_d8,auVar119,local_268);
    auVar45 = vfmadd213ps_fma(local_e8,auVar119,local_278);
    auVar55 = vsubps_avx(auVar48,auVar63);
    auVar63 = vfmadd213ps_fma(auVar55,auVar119,auVar63);
    auVar55 = vsubps_avx(auVar45,auVar48);
    auVar55 = vfmadd213ps_fma(auVar55,auVar119,auVar48);
    auVar55 = vsubps_avx(auVar55,auVar63);
    auVar63 = vfmadd231ps_fma(auVar63,auVar55,auVar119);
    auVar46 = vmulps_avx512vl(auVar55,auVar54);
    auVar230._8_8_ = auVar63._0_8_;
    auVar230._0_8_ = auVar63._0_8_;
    auVar55 = vshufpd_avx(auVar63,auVar63,3);
    auVar63 = vshufps_avx(auVar50,auVar50,0x55);
    auVar48 = vsubps_avx(auVar55,auVar230);
    auVar45 = vfmadd231ps_fma(auVar230,auVar63,auVar48);
    auVar242._8_8_ = auVar46._0_8_;
    auVar242._0_8_ = auVar46._0_8_;
    auVar55 = vshufpd_avx(auVar46,auVar46,3);
    auVar55 = vsubps_avx512vl(auVar55,auVar242);
    auVar55 = vfmadd213ps_avx512vl(auVar55,auVar63,auVar242);
    auVar120._0_8_ = auVar48._0_8_ ^ 0x8000000080000000;
    auVar120._8_4_ = auVar48._8_4_ ^ 0x80000000;
    auVar120._12_4_ = auVar48._12_4_ ^ 0x80000000;
    auVar63 = vmovshdup_avx512vl(auVar55);
    auVar243._0_8_ = auVar63._0_8_ ^ 0x8000000080000000;
    auVar243._8_4_ = auVar63._8_4_ ^ 0x80000000;
    auVar243._12_4_ = auVar63._12_4_ ^ 0x80000000;
    auVar46 = vmovshdup_avx512vl(auVar48);
    auVar49 = vpermt2ps_avx512vl(auVar243,ZEXT416(5),auVar48);
    auVar63 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar63._0_4_ * auVar48._0_4_)),auVar55,auVar46);
    auVar48 = vpermt2ps_avx512vl(auVar55,SUB6416(ZEXT464(4),0),auVar120);
    auVar143._0_4_ = auVar63._0_4_;
    auVar143._4_4_ = auVar143._0_4_;
    auVar143._8_4_ = auVar143._0_4_;
    auVar143._12_4_ = auVar143._0_4_;
    auVar55 = vdivps_avx(auVar49,auVar143);
    auVar38 = vdivps_avx512vl(auVar48,auVar143);
    fVar219 = auVar45._0_4_;
    auVar63 = vshufps_avx(auVar45,auVar45,0x55);
    auVar231._0_4_ = fVar219 * auVar55._0_4_ + auVar63._0_4_ * auVar38._0_4_;
    auVar231._4_4_ = fVar219 * auVar55._4_4_ + auVar63._4_4_ * auVar38._4_4_;
    auVar231._8_4_ = fVar219 * auVar55._8_4_ + auVar63._8_4_ * auVar38._8_4_;
    auVar231._12_4_ = fVar219 * auVar55._12_4_ + auVar63._12_4_ * auVar38._12_4_;
    auVar51 = vsubps_avx(auVar62,auVar231);
    auVar63 = vmovshdup_avx(auVar55);
    auVar62 = vinsertps_avx(auVar186,auVar223,0x1c);
    auVar244._0_4_ = auVar63._0_4_ * auVar62._0_4_;
    auVar244._4_4_ = auVar63._4_4_ * auVar62._4_4_;
    auVar244._8_4_ = auVar63._8_4_ * auVar62._8_4_;
    auVar244._12_4_ = auVar63._12_4_ * auVar62._12_4_;
    auVar52 = vinsertps_avx512f(auVar174,auVar208,0x1c);
    auVar63 = vmulps_avx512vl(auVar63,auVar52);
    auVar49 = vminps_avx512vl(auVar244,auVar63);
    auVar45 = vmaxps_avx(auVar63,auVar244);
    auVar46 = vmovshdup_avx(auVar38);
    auVar63 = vinsertps_avx(auVar223,auVar186,0x4c);
    auVar224._0_4_ = auVar46._0_4_ * auVar63._0_4_;
    auVar224._4_4_ = auVar46._4_4_ * auVar63._4_4_;
    auVar224._8_4_ = auVar46._8_4_ * auVar63._8_4_;
    auVar224._12_4_ = auVar46._12_4_ * auVar63._12_4_;
    auVar48 = vinsertps_avx(auVar208,auVar174,0x4c);
    auVar209._0_4_ = auVar46._0_4_ * auVar48._0_4_;
    auVar209._4_4_ = auVar46._4_4_ * auVar48._4_4_;
    auVar209._8_4_ = auVar46._8_4_ * auVar48._8_4_;
    auVar209._12_4_ = auVar46._12_4_ * auVar48._12_4_;
    auVar46 = vminps_avx(auVar224,auVar209);
    auVar49 = vaddps_avx512vl(auVar49,auVar46);
    auVar46 = vmaxps_avx(auVar209,auVar224);
    auVar210._0_4_ = auVar45._0_4_ + auVar46._0_4_;
    auVar210._4_4_ = auVar45._4_4_ + auVar46._4_4_;
    auVar210._8_4_ = auVar45._8_4_ + auVar46._8_4_;
    auVar210._12_4_ = auVar45._12_4_ + auVar46._12_4_;
    auVar225._8_8_ = 0x3f80000000000000;
    auVar225._0_8_ = 0x3f80000000000000;
    auVar45 = vsubps_avx(auVar225,auVar210);
    auVar46 = vsubps_avx(auVar225,auVar49);
    auVar49 = vsubps_avx(auVar64,auVar50);
    auVar50 = vsubps_avx(auVar60,auVar50);
    fVar216 = auVar49._0_4_;
    auVar245._0_4_ = fVar216 * auVar45._0_4_;
    fVar217 = auVar49._4_4_;
    auVar245._4_4_ = fVar217 * auVar45._4_4_;
    fVar218 = auVar49._8_4_;
    auVar245._8_4_ = fVar218 * auVar45._8_4_;
    fVar160 = auVar49._12_4_;
    auVar245._12_4_ = fVar160 * auVar45._12_4_;
    auVar39 = vbroadcastss_avx512vl(auVar55);
    auVar62 = vmulps_avx512vl(auVar39,auVar62);
    auVar52 = vmulps_avx512vl(auVar39,auVar52);
    auVar39 = vminps_avx512vl(auVar62,auVar52);
    auVar52 = vmaxps_avx512vl(auVar52,auVar62);
    auVar62 = vbroadcastss_avx512vl(auVar38);
    auVar63 = vmulps_avx512vl(auVar62,auVar63);
    auVar62 = vmulps_avx512vl(auVar62,auVar48);
    auVar48 = vminps_avx512vl(auVar63,auVar62);
    auVar48 = vaddps_avx512vl(auVar39,auVar48);
    auVar49 = vmulps_avx512vl(auVar49,auVar46);
    fVar219 = auVar50._0_4_;
    auVar211._0_4_ = fVar219 * auVar45._0_4_;
    fVar203 = auVar50._4_4_;
    auVar211._4_4_ = fVar203 * auVar45._4_4_;
    fVar214 = auVar50._8_4_;
    auVar211._8_4_ = fVar214 * auVar45._8_4_;
    fVar215 = auVar50._12_4_;
    auVar211._12_4_ = fVar215 * auVar45._12_4_;
    auVar226._0_4_ = fVar219 * auVar46._0_4_;
    auVar226._4_4_ = fVar203 * auVar46._4_4_;
    auVar226._8_4_ = fVar214 * auVar46._8_4_;
    auVar226._12_4_ = fVar215 * auVar46._12_4_;
    auVar62 = vmaxps_avx(auVar62,auVar63);
    auVar175._0_4_ = auVar52._0_4_ + auVar62._0_4_;
    auVar175._4_4_ = auVar52._4_4_ + auVar62._4_4_;
    auVar175._8_4_ = auVar52._8_4_ + auVar62._8_4_;
    auVar175._12_4_ = auVar52._12_4_ + auVar62._12_4_;
    auVar187._8_8_ = 0x3f800000;
    auVar187._0_8_ = 0x3f800000;
    auVar62 = vsubps_avx(auVar187,auVar175);
    auVar63 = vsubps_avx512vl(auVar187,auVar48);
    auVar237._0_4_ = fVar216 * auVar62._0_4_;
    auVar237._4_4_ = fVar217 * auVar62._4_4_;
    auVar237._8_4_ = fVar218 * auVar62._8_4_;
    auVar237._12_4_ = fVar160 * auVar62._12_4_;
    auVar232._0_4_ = fVar216 * auVar63._0_4_;
    auVar232._4_4_ = fVar217 * auVar63._4_4_;
    auVar232._8_4_ = fVar218 * auVar63._8_4_;
    auVar232._12_4_ = fVar160 * auVar63._12_4_;
    auVar176._0_4_ = fVar219 * auVar62._0_4_;
    auVar176._4_4_ = fVar203 * auVar62._4_4_;
    auVar176._8_4_ = fVar214 * auVar62._8_4_;
    auVar176._12_4_ = fVar215 * auVar62._12_4_;
    auVar188._0_4_ = fVar219 * auVar63._0_4_;
    auVar188._4_4_ = fVar203 * auVar63._4_4_;
    auVar188._8_4_ = fVar214 * auVar63._8_4_;
    auVar188._12_4_ = fVar215 * auVar63._12_4_;
    auVar62 = vminps_avx(auVar237,auVar232);
    auVar63 = vminps_avx512vl(auVar176,auVar188);
    auVar48 = vminps_avx512vl(auVar62,auVar63);
    auVar62 = vmaxps_avx(auVar232,auVar237);
    auVar63 = vmaxps_avx(auVar188,auVar176);
    auVar63 = vmaxps_avx(auVar63,auVar62);
    auVar45 = vminps_avx512vl(auVar245,auVar49);
    auVar62 = vminps_avx(auVar211,auVar226);
    auVar62 = vminps_avx(auVar45,auVar62);
    auVar62 = vhaddps_avx(auVar48,auVar62);
    auVar84._0_16_ = vmaxps_avx512vl(auVar49,auVar245);
    auVar48 = vmaxps_avx(auVar226,auVar211);
    auVar48 = vmaxps_avx(auVar48,auVar84._0_16_);
    auVar63 = vhaddps_avx(auVar63,auVar48);
    auVar62 = vshufps_avx(auVar62,auVar62,0xe8);
    auVar63 = vshufps_avx(auVar63,auVar63,0xe8);
    auVar177._0_4_ = auVar62._0_4_ + auVar51._0_4_;
    auVar177._4_4_ = auVar62._4_4_ + auVar51._4_4_;
    auVar177._8_4_ = auVar62._8_4_ + auVar51._8_4_;
    auVar177._12_4_ = auVar62._12_4_ + auVar51._12_4_;
    auVar189._0_4_ = auVar63._0_4_ + auVar51._0_4_;
    auVar189._4_4_ = auVar63._4_4_ + auVar51._4_4_;
    auVar189._8_4_ = auVar63._8_4_ + auVar51._8_4_;
    auVar189._12_4_ = auVar63._12_4_ + auVar51._12_4_;
    auVar62 = vmaxps_avx(auVar64,auVar177);
    auVar63 = vminps_avx(auVar189,auVar60);
    uVar2 = vcmpps_avx512vl(auVar63,auVar62,1);
  } while ((uVar2 & 3) != 0);
  uVar2 = vcmpps_avx512vl(auVar189,auVar60,1);
  uVar14 = vcmpps_avx512vl(auVar56,auVar177,1);
  if (((ushort)uVar14 & (ushort)uVar2 & 1) == 0) {
    bVar24 = 0;
  }
  else {
    auVar62 = vmovshdup_avx(auVar177);
    bVar24 = auVar53._0_4_ < auVar62._0_4_ & (byte)(uVar2 >> 1) & 0x7f;
  }
  if (((3 < (uint)uVar26 || uVar7 != 0 && !bVar36) | bVar24) != 1) goto LAB_018b9a44;
  lVar28 = 0xc9;
  do {
    lVar28 = lVar28 + -1;
    if (lVar28 == 0) goto LAB_018b8bfd;
    auVar56 = vsubss_avx512f(auVar47,auVar51);
    fVar214 = auVar56._0_4_;
    fVar219 = fVar214 * fVar214 * fVar214;
    auVar56 = vmulss_avx512f(auVar51,ZEXT416(0x40400000));
    fVar203 = auVar56._0_4_ * fVar214 * fVar214;
    fVar215 = auVar51._0_4_;
    auVar56 = vmulss_avx512f(ZEXT416((uint)(fVar215 * fVar215)),ZEXT416(0x40400000));
    fVar214 = fVar214 * auVar56._0_4_;
    auVar132._4_4_ = fVar219;
    auVar132._0_4_ = fVar219;
    auVar132._8_4_ = fVar219;
    auVar132._12_4_ = fVar219;
    auVar126._4_4_ = fVar203;
    auVar126._0_4_ = fVar203;
    auVar126._8_4_ = fVar203;
    auVar126._12_4_ = fVar203;
    auVar109._4_4_ = fVar214;
    auVar109._0_4_ = fVar214;
    auVar109._8_4_ = fVar214;
    auVar109._12_4_ = fVar214;
    fVar215 = fVar215 * fVar215 * fVar215;
    auVar157._0_4_ = (float)local_f8._0_4_ * fVar215;
    auVar157._4_4_ = (float)local_f8._4_4_ * fVar215;
    auVar157._8_4_ = fStack_f0 * fVar215;
    auVar157._12_4_ = fStack_ec * fVar215;
    auVar56 = vfmadd231ps_fma(auVar157,local_278,auVar109);
    auVar56 = vfmadd231ps_fma(auVar56,local_268,auVar126);
    auVar56 = vfmadd231ps_fma(auVar56,local_318,auVar132);
    auVar110._8_8_ = auVar56._0_8_;
    auVar110._0_8_ = auVar56._0_8_;
    auVar56 = vshufpd_avx(auVar56,auVar56,3);
    auVar62 = vshufps_avx(auVar51,auVar51,0x55);
    auVar56 = vsubps_avx(auVar56,auVar110);
    auVar62 = vfmadd213ps_fma(auVar56,auVar62,auVar110);
    fVar219 = auVar62._0_4_;
    auVar56 = vshufps_avx(auVar62,auVar62,0x55);
    auVar111._0_4_ = auVar55._0_4_ * fVar219 + auVar38._0_4_ * auVar56._0_4_;
    auVar111._4_4_ = auVar55._4_4_ * fVar219 + auVar38._4_4_ * auVar56._4_4_;
    auVar111._8_4_ = auVar55._8_4_ * fVar219 + auVar38._8_4_ * auVar56._8_4_;
    auVar111._12_4_ = auVar55._12_4_ * fVar219 + auVar38._12_4_ * auVar56._12_4_;
    auVar51 = vsubps_avx(auVar51,auVar111);
    auVar56 = vandps_avx512vl(auVar62,auVar250._0_16_);
    auVar84._0_16_ = vprolq_avx512vl(auVar56,0x20);
    auVar56 = vmaxss_avx(auVar84._0_16_,auVar56);
    bVar36 = (float)local_108._0_4_ < auVar56._0_4_;
  } while ((float)local_108._0_4_ <= auVar56._0_4_);
  auVar56 = vucomiss_avx512f(auVar61);
  if (bVar36) goto LAB_018b8bfd;
  auVar55 = vucomiss_avx512f(auVar56);
  auVar252 = ZEXT1664(auVar55);
  if (bVar36) goto LAB_018b8bfd;
  vmovshdup_avx(auVar56);
  auVar55 = vucomiss_avx512f(auVar61);
  if (bVar36) goto LAB_018b8bfd;
  auVar62 = vucomiss_avx512f(auVar55);
  auVar252 = ZEXT1664(auVar62);
  if (bVar36) goto LAB_018b8bfd;
  auVar63 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                          ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
  auVar50 = vinsertps_avx(auVar63,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28);
  aVar3 = (ray->super_RayK<1>).org.field_0;
  auVar63 = vsubps_avx(local_1a8,(undefined1  [16])aVar3);
  auVar63 = vdpps_avx(auVar63,auVar50,0x7f);
  auVar64 = vsubps_avx(local_1b8,(undefined1  [16])aVar3);
  auVar64 = vdpps_avx(auVar64,auVar50,0x7f);
  auVar48 = vsubps_avx(local_1c8,(undefined1  [16])aVar3);
  auVar48 = vdpps_avx(auVar48,auVar50,0x7f);
  auVar45 = vsubps_avx(local_1d8,(undefined1  [16])aVar3);
  auVar45 = vdpps_avx(auVar45,auVar50,0x7f);
  auVar46 = vsubps_avx(_local_1e8,(undefined1  [16])aVar3);
  auVar46 = vdpps_avx(auVar46,auVar50,0x7f);
  auVar47 = vsubps_avx(_local_1f8,(undefined1  [16])aVar3);
  auVar47 = vdpps_avx(auVar47,auVar50,0x7f);
  auVar49 = vsubps_avx(_local_208,(undefined1  [16])aVar3);
  auVar49 = vdpps_avx(auVar49,auVar50,0x7f);
  auVar51 = vsubps_avx(_local_218,(undefined1  [16])aVar3);
  auVar50 = vdpps_avx(auVar51,auVar50,0x7f);
  auVar51 = vsubss_avx512f(auVar62,auVar55);
  fVar219 = auVar55._0_4_;
  auVar55 = vfmadd231ss_fma(ZEXT416((uint)(auVar46._0_4_ * fVar219)),auVar51,auVar63);
  auVar63 = vfmadd231ss_fma(ZEXT416((uint)(auVar47._0_4_ * fVar219)),auVar51,auVar64);
  auVar64 = vfmadd231ss_fma(ZEXT416((uint)(auVar49._0_4_ * fVar219)),auVar51,auVar48);
  auVar48 = vfmadd231ss_fma(ZEXT416((uint)(fVar219 * auVar50._0_4_)),auVar51,auVar45);
  auVar62 = vsubss_avx512f(auVar62,auVar56);
  auVar158._0_4_ = auVar62._0_4_;
  fVar203 = auVar158._0_4_ * auVar158._0_4_ * auVar158._0_4_;
  auVar62 = vmulss_avx512f(auVar56,ZEXT416(0x40400000));
  fVar214 = auVar62._0_4_ * auVar158._0_4_ * auVar158._0_4_;
  fVar219 = auVar56._0_4_;
  auVar144._0_4_ = fVar219 * fVar219;
  auVar144._4_4_ = auVar56._4_4_ * auVar56._4_4_;
  auVar144._8_4_ = auVar56._8_4_ * auVar56._8_4_;
  auVar144._12_4_ = auVar56._12_4_ * auVar56._12_4_;
  auVar84._0_16_ = vmulss_avx512f(auVar144,ZEXT416(0x40400000));
  fVar215 = auVar158._0_4_ * auVar84._0_4_;
  fVar217 = fVar219 * auVar144._0_4_;
  auVar62 = vfmadd231ss_fma(ZEXT416((uint)(fVar217 * auVar48._0_4_)),ZEXT416((uint)fVar215),auVar64)
  ;
  auVar62 = vfmadd231ss_fma(auVar62,ZEXT416((uint)fVar214),auVar63);
  auVar55 = vfmadd231ss_fma(auVar62,ZEXT416((uint)fVar203),auVar55);
  fVar216 = auVar55._0_4_;
  if ((fVar216 < (ray->super_RayK<1>).org.field_0.m128[3]) ||
     (fVar218 = (ray->super_RayK<1>).tfar, fVar218 < fVar216)) goto LAB_018b8bfd;
  auVar55 = vshufps_avx(auVar56,auVar56,0x55);
  auVar63 = vsubps_avx512vl(auVar58,auVar55);
  fVar160 = auVar55._0_4_;
  auVar190._0_4_ = fVar160 * (float)local_1e8._0_4_;
  fVar169 = auVar55._4_4_;
  auVar190._4_4_ = fVar169 * (float)local_1e8._4_4_;
  fVar178 = auVar55._8_4_;
  auVar190._8_4_ = fVar178 * fStack_1e0;
  fVar192 = auVar55._12_4_;
  auVar190._12_4_ = fVar192 * fStack_1dc;
  auVar200._0_4_ = fVar160 * (float)local_1f8._0_4_;
  auVar200._4_4_ = fVar169 * (float)local_1f8._4_4_;
  auVar200._8_4_ = fVar178 * fStack_1f0;
  auVar200._12_4_ = fVar192 * fStack_1ec;
  auVar212._0_4_ = fVar160 * (float)local_208._0_4_;
  auVar212._4_4_ = fVar169 * (float)local_208._4_4_;
  auVar212._8_4_ = fVar178 * fStack_200;
  auVar212._12_4_ = fVar192 * fStack_1fc;
  auVar166._0_4_ = fVar160 * (float)local_218._0_4_;
  auVar166._4_4_ = fVar169 * (float)local_218._4_4_;
  auVar166._8_4_ = fVar178 * fStack_210;
  auVar166._12_4_ = fVar192 * fStack_20c;
  auVar58 = vfmadd231ps_fma(auVar190,auVar63,local_1a8);
  auVar55 = vfmadd231ps_fma(auVar200,auVar63,local_1b8);
  auVar62 = vfmadd231ps_fma(auVar212,auVar63,local_1c8);
  auVar63 = vfmadd231ps_fma(auVar166,auVar63,local_1d8);
  auVar58 = vsubps_avx(auVar55,auVar58);
  auVar55 = vsubps_avx(auVar62,auVar55);
  auVar62 = vsubps_avx(auVar63,auVar62);
  auVar213._0_4_ = fVar219 * auVar55._0_4_;
  auVar213._4_4_ = fVar219 * auVar55._4_4_;
  auVar213._8_4_ = fVar219 * auVar55._8_4_;
  auVar213._12_4_ = fVar219 * auVar55._12_4_;
  auVar158._4_4_ = auVar158._0_4_;
  auVar158._8_4_ = auVar158._0_4_;
  auVar158._12_4_ = auVar158._0_4_;
  auVar58 = vfmadd231ps_fma(auVar213,auVar158,auVar58);
  auVar167._0_4_ = fVar219 * auVar62._0_4_;
  auVar167._4_4_ = fVar219 * auVar62._4_4_;
  auVar167._8_4_ = fVar219 * auVar62._8_4_;
  auVar167._12_4_ = fVar219 * auVar62._12_4_;
  auVar55 = vfmadd231ps_fma(auVar167,auVar158,auVar55);
  auVar168._0_4_ = fVar219 * auVar55._0_4_;
  auVar168._4_4_ = fVar219 * auVar55._4_4_;
  auVar168._8_4_ = fVar219 * auVar55._8_4_;
  auVar168._12_4_ = fVar219 * auVar55._12_4_;
  auVar58 = vfmadd231ps_fma(auVar168,auVar158,auVar58);
  auVar84._0_16_ = vmulps_avx512vl(auVar58,auVar54);
  pGVar8 = (context->scene->geometries).items[uVar6].ptr;
  if ((pGVar8->mask & (ray->super_RayK<1>).mask) == 0) goto LAB_018b8bfd;
  auVar145._0_4_ = fVar217 * (float)local_148._0_4_;
  auVar145._4_4_ = fVar217 * (float)local_148._4_4_;
  auVar145._8_4_ = fVar217 * fStack_140;
  auVar145._12_4_ = fVar217 * fStack_13c;
  auVar133._4_4_ = fVar215;
  auVar133._0_4_ = fVar215;
  auVar133._8_4_ = fVar215;
  auVar133._12_4_ = fVar215;
  auVar54 = vfmadd132ps_fma(auVar133,auVar145,local_138);
  auVar127._4_4_ = fVar214;
  auVar127._0_4_ = fVar214;
  auVar127._8_4_ = fVar214;
  auVar127._12_4_ = fVar214;
  auVar54 = vfmadd132ps_fma(auVar127,auVar54,local_128);
  auVar121._4_4_ = fVar203;
  auVar121._0_4_ = fVar203;
  auVar121._8_4_ = fVar203;
  auVar121._12_4_ = fVar203;
  auVar55 = vfmadd132ps_fma(auVar121,auVar54,local_118);
  auVar54 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar58 = vshufps_avx(auVar84._0_16_,auVar84._0_16_,0xc9);
  auVar122._0_4_ = auVar55._0_4_ * auVar58._0_4_;
  auVar122._4_4_ = auVar55._4_4_ * auVar58._4_4_;
  auVar122._8_4_ = auVar55._8_4_ * auVar58._8_4_;
  auVar122._12_4_ = auVar55._12_4_ * auVar58._12_4_;
  auVar58 = vfmsub231ps_fma(auVar122,auVar84._0_16_,auVar54);
  auVar54 = vshufps_avx(auVar58,auVar58,0xe9);
  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
     (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
    (ray->super_RayK<1>).tfar = fVar216;
    uVar14 = vmovlps_avx(auVar54);
    *(undefined8 *)&(ray->Ng).field_0 = uVar14;
    (ray->Ng).field_0.field_0.z = auVar58._0_4_;
    uVar14 = vmovlps_avx(auVar56);
    ray->u = (float)(int)uVar14;
    ray->v = (float)(int)((ulong)uVar14 >> 0x20);
    ray->primID = (uint)local_300;
    ray->geomID = uVar6;
    ray->instID[0] = context->user->instID[0];
    ray->instPrimID[0] = context->user->instPrimID[0];
    goto LAB_018b8bfd;
  }
  local_188 = vmovlps_avx(auVar54);
  local_180 = auVar58._0_4_;
  local_17c = vmovlps_avx(auVar56);
  local_174 = (uint)local_300;
  local_170 = uVar6;
  local_16c = context->user->instID[0];
  local_168 = context->user->instPrimID[0];
  (ray->super_RayK<1>).tfar = fVar216;
  local_31c = -1;
  local_248.valid = &local_31c;
  local_248.geometryUserPtr = pGVar8->userPtr;
  local_248.context = context->user;
  local_248.ray = (RTCRayN *)ray;
  local_248.hit = (RTCHitN *)&local_188;
  local_248.N = 1;
  if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
    local_258 = lVar30;
    (*pGVar8->intersectionFilterN)(&local_248);
    auVar248 = ZEXT3264(_DAT_01fb9fe0);
    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar247 = ZEXT1664(auVar56);
    auVar84 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar246 = ZEXT3264(auVar84);
    auVar252 = ZEXT464(0x3f800000);
    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar249 = ZEXT1664(auVar56);
    auVar56 = vxorps_avx512vl(auVar61,auVar61);
    auVar253 = ZEXT1664(auVar56);
    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar251 = ZEXT1664(auVar56);
    auVar84._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar250 = ZEXT1664(auVar84._0_16_);
    lVar30 = local_258;
    if (*local_248.valid == 0) goto LAB_018b9a33;
  }
  auVar56 = auVar253._0_16_;
  p_Var13 = context->args->filter;
  if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
    (*p_Var13)(&local_248);
    auVar248 = ZEXT3264(_DAT_01fb9fe0);
    auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar247 = ZEXT1664(auVar54);
    auVar84 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar246 = ZEXT3264(auVar84);
    auVar252 = ZEXT464(0x3f800000);
    auVar54 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar249 = ZEXT1664(auVar54);
    auVar56 = vxorps_avx512vl(auVar56,auVar56);
    auVar253 = ZEXT1664(auVar56);
    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar251 = ZEXT1664(auVar56);
    auVar84._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar250 = ZEXT1664(auVar84._0_16_);
    if (*local_248.valid == 0) {
LAB_018b9a33:
      auVar252 = ZEXT464(0x3f800000);
      (ray->super_RayK<1>).tfar = fVar218;
      goto LAB_018b8bfd;
    }
  }
  (((Vec3f *)((long)local_248.ray + 0x30))->field_0).components[0] = *(float *)local_248.hit;
  (((Vec3f *)((long)local_248.ray + 0x30))->field_0).field_0.y = *(float *)(local_248.hit + 4);
  (((Vec3f *)((long)local_248.ray + 0x30))->field_0).field_0.z = *(float *)(local_248.hit + 8);
  *(float *)((long)local_248.ray + 0x3c) = *(float *)(local_248.hit + 0xc);
  *(float *)((long)local_248.ray + 0x40) = *(float *)(local_248.hit + 0x10);
  *(float *)((long)local_248.ray + 0x44) = *(float *)(local_248.hit + 0x14);
  *(float *)((long)local_248.ray + 0x48) = *(float *)(local_248.hit + 0x18);
  *(float *)((long)local_248.ray + 0x4c) = *(float *)(local_248.hit + 0x1c);
  *(float *)((long)local_248.ray + 0x50) = *(float *)(local_248.hit + 0x20);
  goto LAB_018b8bfd;
LAB_018b9a44:
  auVar40 = vinsertps_avx(auVar53,auVar59,0x10);
  goto LAB_018b86fb;
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());
          Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }